

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Primitive PVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined3 uVar38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  uint uVar66;
  undefined6 uVar67;
  undefined1 auVar68 [12];
  unkbyte9 Var69;
  undefined1 auVar70 [13];
  undefined1 auVar71 [12];
  undefined1 auVar72 [13];
  undefined1 auVar73 [12];
  undefined1 auVar74 [13];
  undefined1 auVar75 [12];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [15];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  bool bVar93;
  bool bVar94;
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [13];
  undefined1 auVar100 [15];
  byte bVar101;
  ulong uVar102;
  ulong uVar103;
  RTCFilterFunctionN p_Var104;
  RTCRayN *pRVar105;
  long lVar106;
  long lVar107;
  ulong uVar108;
  ulong uVar109;
  bool bVar110;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  short sVar115;
  undefined2 uVar158;
  float fVar116;
  undefined1 auVar117 [12];
  float fVar159;
  vfloat_impl<4> p00;
  float fVar160;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar118 [12];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar161;
  undefined2 uVar194;
  float fVar195;
  undefined2 uVar197;
  float fVar198;
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar196;
  float fVar199;
  float fVar200;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  char cVar201;
  int iVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar206 [12];
  char cVar231;
  int iVar232;
  vfloat4 a_1;
  undefined1 auVar208 [16];
  char cVar236;
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar207 [12];
  undefined1 auVar220 [16];
  float fVar235;
  float fVar237;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar238;
  float fVar239;
  float fVar247;
  float fVar249;
  undefined1 auVar242 [16];
  float fVar248;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar252;
  float fVar253;
  float fVar270;
  float fVar272;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  float fVar271;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  char cVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar278 [16];
  float fVar292;
  float fVar293;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar295 [16];
  undefined1 auVar300 [12];
  float fVar314;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar306 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar318;
  float fVar319;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float fVar333;
  float fVar347;
  float fVar350;
  vfloat4 a;
  float fVar334;
  float fVar335;
  undefined1 auVar336 [16];
  undefined1 auVar339 [16];
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar366;
  float fVar369;
  vfloat4 a_2;
  undefined1 auVar360 [16];
  float fVar367;
  float fVar368;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  float fVar375;
  float fVar382;
  vfloat4 a_3;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar396;
  float fVar397;
  float fVar401;
  float fVar402;
  float fVar407;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar422;
  float fVar427;
  undefined1 auVar417 [16];
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar443;
  float fVar444;
  float fVar445;
  undefined1 auVar439 [16];
  float fVar446;
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  float fVar447;
  float fVar448;
  float fVar454;
  float fVar456;
  undefined1 auVar449 [16];
  float fVar458;
  undefined1 auVar452 [16];
  float fVar455;
  float fVar457;
  float fVar459;
  undefined1 auVar453 [16];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  BBox1f local_538;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  vfloat_impl<4> p00_1;
  undefined8 local_4f8;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_3a8 [16];
  undefined1 (*local_390) [16];
  Primitive *local_388;
  ulong local_380;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 uVar157;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar205 [12];
  undefined1 auVar213 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  int iVar233;
  int iVar234;
  undefined1 auVar240 [12];
  undefined1 auVar243 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  
  PVar15 = prim[1];
  uVar102 = (ulong)(byte)PVar15;
  lVar106 = uVar102 * 0x25;
  uVar5 = *(undefined4 *)(prim + uVar102 * 4 + 6);
  uVar16 = *(undefined4 *)(prim + uVar102 * 5 + 6);
  uVar17 = *(undefined4 *)(prim + uVar102 * 6 + 6);
  uVar18 = *(undefined4 *)(prim + uVar102 * 0xf + 6);
  uVar19 = *(undefined4 *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  uVar20 = *(undefined4 *)(prim + uVar102 * 0x11 + 6);
  uVar21 = *(undefined4 *)(prim + uVar102 * 0x1a + 6);
  uVar22 = *(undefined4 *)(prim + uVar102 * 0x1b + 6);
  pPVar4 = prim + lVar106 + 6;
  fVar401 = *(float *)(pPVar4 + 0xc);
  fVar161 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar401;
  fVar195 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar401;
  fVar198 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar401;
  fVar383 = *(float *)(ray + k * 4 + 0x40) * fVar401;
  fVar396 = *(float *)(ray + k * 4 + 0x50) * fVar401;
  fVar401 = *(float *)(ray + k * 4 + 0x60) * fVar401;
  uVar157 = (undefined1)((uint)uVar16 >> 0x18);
  uVar158 = CONCAT11(uVar157,uVar157);
  uVar157 = (undefined1)((uint)uVar16 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar158,uVar157),CONCAT14(uVar157,uVar16));
  cVar231 = (char)((uint)uVar16 >> 8);
  uVar67 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),cVar231),cVar231);
  cVar201 = (char)uVar16;
  uVar108 = CONCAT62(uVar67,CONCAT11(cVar201,cVar201));
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar108;
  auVar210._12_2_ = uVar158;
  auVar210._14_2_ = uVar158;
  uVar158 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar108;
  auVar209._10_2_ = uVar158;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar158;
  auVar208._0_8_ = uVar108;
  uVar158 = (undefined2)uVar67;
  auVar68._4_8_ = auVar208._8_8_;
  auVar68._2_2_ = uVar158;
  auVar68._0_2_ = uVar158;
  iVar202 = (int)CONCAT11(cVar201,cVar201) >> 8;
  iVar232 = auVar68._0_4_ >> 0x18;
  auVar205._0_8_ = CONCAT44(iVar232,iVar202);
  auVar205._8_4_ = auVar208._8_4_ >> 0x18;
  auVar211._12_4_ = auVar209._12_4_ >> 0x18;
  auVar211._0_12_ = auVar205;
  fVar296 = (float)iVar232;
  cVar236 = cVar231 >> 7;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar211._0_13_;
  auVar42[0xe] = cVar236;
  auVar45[0xc] = cVar236;
  auVar45._0_12_ = auVar205;
  auVar45._13_2_ = auVar42._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar205._0_11_;
  auVar48._12_3_ = auVar45._12_3_;
  auVar51[10] = cVar236;
  auVar51._0_10_ = auVar205._0_10_;
  auVar51._11_4_ = auVar48._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = auVar205._0_9_;
  auVar54._10_5_ = auVar51._10_5_;
  auVar57[8] = cVar231;
  auVar57._0_8_ = auVar205._0_8_;
  auVar57._9_6_ = auVar54._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar57._8_7_,(char)((uint)uVar17 >> 0x18)),(short)cVar201 >> 7);
  auVar60._6_9_ = Var69;
  auVar60[5] = (char)((uint)uVar17 >> 0x10);
  auVar60[4] = (undefined1)((short)cVar201 >> 7);
  auVar60._0_4_ = iVar202;
  cVar236 = (char)((uint)uVar17 >> 8);
  auVar70._2_11_ = auVar60._4_11_;
  auVar70[1] = cVar236;
  auVar70[0] = (undefined1)((short)cVar201 >> 7);
  cVar231 = (char)uVar17;
  auVar63._2_13_ = auVar70;
  auVar63._0_2_ = CONCAT11(cVar231,cVar201);
  uVar158 = (undefined2)Var69;
  auVar214._0_12_ = auVar63._0_12_;
  auVar214._12_2_ = uVar158;
  auVar214._14_2_ = uVar158;
  auVar213._12_4_ = auVar214._12_4_;
  auVar213._0_10_ = auVar63._0_10_;
  auVar213._10_2_ = auVar60._4_2_;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._0_8_ = auVar63._0_8_;
  auVar212._8_2_ = auVar60._4_2_;
  auVar71._4_8_ = auVar212._8_8_;
  auVar71._2_2_ = auVar70._0_2_;
  auVar71._0_2_ = auVar70._0_2_;
  iVar232 = (int)CONCAT11(cVar231,cVar201) >> 8;
  iVar233 = auVar71._0_4_ >> 0x18;
  auVar206._0_8_ = CONCAT44(iVar233,iVar232);
  auVar206._8_4_ = auVar212._8_4_ >> 0x18;
  auVar215._12_4_ = auVar213._12_4_ >> 0x18;
  auVar215._0_12_ = auVar206;
  fVar382 = (float)iVar233;
  cVar201 = cVar236 >> 7;
  auVar43[0xd] = 0;
  auVar43._0_13_ = auVar215._0_13_;
  auVar43[0xe] = cVar201;
  auVar46[0xc] = cVar201;
  auVar46._0_12_ = auVar206;
  auVar46._13_2_ = auVar43._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar206._0_11_;
  auVar49._12_3_ = auVar46._12_3_;
  auVar52[10] = cVar201;
  auVar52._0_10_ = auVar206._0_10_;
  auVar52._11_4_ = auVar49._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar206._0_9_;
  auVar55._10_5_ = auVar52._10_5_;
  auVar58[8] = cVar236;
  auVar58._0_8_ = auVar206._0_8_;
  auVar58._9_6_ = auVar55._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar231 >> 7);
  auVar61._6_9_ = Var69;
  auVar61[5] = (char)((uint)uVar19 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar231 >> 7);
  auVar61._0_4_ = iVar232;
  cVar289 = (char)((uint)uVar19 >> 8);
  auVar72._2_11_ = auVar61._4_11_;
  auVar72[1] = cVar289;
  auVar72[0] = (undefined1)((short)cVar231 >> 7);
  cVar236 = (char)uVar19;
  auVar64._2_13_ = auVar72;
  auVar64._0_2_ = CONCAT11(cVar236,cVar231);
  uVar158 = (undefined2)Var69;
  auVar218._0_12_ = auVar64._0_12_;
  auVar218._12_2_ = uVar158;
  auVar218._14_2_ = uVar158;
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._0_10_ = auVar64._0_10_;
  auVar217._10_2_ = auVar61._4_2_;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._0_8_ = auVar64._0_8_;
  auVar216._8_2_ = auVar61._4_2_;
  auVar73._4_8_ = auVar216._8_8_;
  auVar73._2_2_ = auVar72._0_2_;
  auVar73._0_2_ = auVar72._0_2_;
  iVar233 = (int)CONCAT11(cVar236,cVar231) >> 8;
  iVar234 = auVar73._0_4_ >> 0x18;
  auVar207._0_8_ = CONCAT44(iVar234,iVar233);
  auVar207._8_4_ = auVar216._8_4_ >> 0x18;
  auVar219._12_4_ = auVar217._12_4_ >> 0x18;
  auVar219._0_12_ = auVar207;
  fVar314 = (float)iVar234;
  cVar201 = cVar289 >> 7;
  auVar44[0xd] = 0;
  auVar44._0_13_ = auVar219._0_13_;
  auVar44[0xe] = cVar201;
  auVar47[0xc] = cVar201;
  auVar47._0_12_ = auVar207;
  auVar47._13_2_ = auVar44._13_2_;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar207._0_11_;
  auVar50._12_3_ = auVar47._12_3_;
  auVar53[10] = cVar201;
  auVar53._0_10_ = auVar207._0_10_;
  auVar53._11_4_ = auVar50._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar207._0_9_;
  auVar56._10_5_ = auVar53._10_5_;
  auVar59[8] = cVar289;
  auVar59._0_8_ = auVar207._0_8_;
  auVar59._9_6_ = auVar56._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar236 >> 7);
  auVar62._6_9_ = Var69;
  auVar62[5] = (char)((uint)uVar20 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar236 >> 7);
  auVar62._0_4_ = iVar233;
  auVar74._2_11_ = auVar62._4_11_;
  auVar74[1] = (char)((uint)uVar20 >> 8);
  auVar74[0] = (undefined1)((short)cVar236 >> 7);
  sVar115 = CONCAT11((char)uVar20,cVar236);
  auVar65._2_13_ = auVar74;
  auVar65._0_2_ = sVar115;
  uVar158 = (undefined2)Var69;
  auVar222._0_12_ = auVar65._0_12_;
  auVar222._12_2_ = uVar158;
  auVar222._14_2_ = uVar158;
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._0_10_ = auVar65._0_10_;
  auVar221._10_2_ = auVar62._4_2_;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._0_8_ = auVar65._0_8_;
  auVar220._8_2_ = auVar62._4_2_;
  auVar75._4_8_ = auVar220._8_8_;
  auVar75._2_2_ = auVar74._0_2_;
  auVar75._0_2_ = auVar74._0_2_;
  fVar318 = (float)((int)sVar115 >> 8);
  fVar328 = (float)(auVar75._0_4_ >> 0x18);
  fVar330 = (float)(auVar220._8_4_ >> 0x18);
  uVar16 = *(undefined4 *)(prim + uVar102 * 0x1c + 6);
  fVar238 = fVar401 * fVar318;
  fVar247 = fVar401 * fVar328;
  auVar240._0_8_ = CONCAT44(fVar247,fVar238);
  auVar240._8_4_ = fVar401 * fVar330;
  auVar241._12_4_ = fVar401 * (float)(auVar221._12_4_ >> 0x18);
  auVar241._0_12_ = auVar240;
  fVar203 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar106 + 0x16)) *
            *(float *)(prim + lVar106 + 0x1a);
  local_548[0] = (undefined1)uVar5;
  local_548[1] = (undefined1)((uint)uVar5 >> 8);
  local_548[2] = (undefined1)((uint)uVar5 >> 0x10);
  local_548[3] = (undefined1)((uint)uVar5 >> 0x18);
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar241._0_13_;
  auVar88[0xe] = (char)((uint)fVar247 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar247 >> 0x10);
  auVar91._0_12_ = auVar240;
  auVar91._13_2_ = auVar88._13_2_;
  auVar92[0xb] = 0;
  auVar92._0_11_ = auVar240._0_11_;
  auVar92._12_3_ = auVar91._12_3_;
  auVar95[10] = (char)((uint)fVar247 >> 8);
  auVar95._0_10_ = auVar240._0_10_;
  auVar95._11_4_ = auVar92._11_4_;
  auVar96[9] = 0;
  auVar96._0_9_ = auVar240._0_9_;
  auVar96._10_5_ = auVar95._10_5_;
  auVar97[8] = SUB41(fVar247,0);
  auVar97._0_8_ = auVar240._0_8_;
  auVar97._9_6_ = auVar96._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar97._8_7_,local_548[3]),(char)((uint)fVar238 >> 0x18));
  auVar98._6_9_ = Var69;
  auVar98[5] = local_548[2];
  auVar98[4] = (char)((uint)fVar238 >> 0x10);
  auVar98._0_4_ = fVar238;
  auVar99._2_11_ = auVar98._4_11_;
  auVar99[1] = local_548[1];
  auVar99[0] = (char)((uint)fVar238 >> 8);
  sVar115 = CONCAT11(local_548[0],SUB41(fVar238,0));
  auVar100._2_13_ = auVar99;
  auVar100._0_2_ = sVar115;
  uVar158 = (undefined2)Var69;
  auVar244._0_12_ = auVar100._0_12_;
  auVar244._12_2_ = uVar158;
  auVar244._14_2_ = uVar158;
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._0_10_ = auVar100._0_10_;
  auVar243._10_2_ = auVar98._4_2_;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._0_8_ = auVar100._0_8_;
  auVar242._8_2_ = auVar98._4_2_;
  auVar76._4_8_ = auVar242._8_8_;
  auVar76._2_2_ = auVar99._0_2_;
  auVar76._0_2_ = auVar99._0_2_;
  fVar239 = (float)((int)sVar115 >> 8);
  fVar248 = (float)(auVar76._0_4_ >> 0x18);
  fVar249 = (float)(auVar242._8_4_ >> 0x18);
  uVar157 = (undefined1)((uint)uVar18 >> 0x18);
  uVar158 = CONCAT11(uVar157,uVar157);
  uVar157 = (undefined1)((uint)uVar18 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar158,uVar157),CONCAT14(uVar157,uVar18));
  uVar157 = (undefined1)((uint)uVar18 >> 8);
  uVar67 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar157),uVar157);
  sVar115 = CONCAT11((char)uVar18,(char)uVar18);
  uVar108 = CONCAT62(uVar67,sVar115);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar108;
  auVar120._12_2_ = uVar158;
  auVar120._14_2_ = uVar158;
  uVar158 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar254._12_4_ = auVar120._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar108;
  auVar254._10_2_ = uVar158;
  auVar178._10_6_ = auVar254._10_6_;
  auVar178._8_2_ = uVar158;
  auVar178._0_8_ = uVar108;
  uVar158 = (undefined2)uVar67;
  auVar77._4_8_ = auVar178._8_8_;
  auVar77._2_2_ = uVar158;
  auVar77._0_2_ = uVar158;
  fVar204 = (float)((int)sVar115 >> 8);
  fVar235 = (float)(auVar77._0_4_ >> 0x18);
  fVar237 = (float)(auVar178._8_4_ >> 0x18);
  uVar157 = (undefined1)((uint)uVar21 >> 0x18);
  uVar158 = CONCAT11(uVar157,uVar157);
  uVar157 = (undefined1)((uint)uVar21 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar158,uVar157),CONCAT14(uVar157,uVar21));
  uVar157 = (undefined1)((uint)uVar21 >> 8);
  uVar67 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar157),uVar157);
  sVar115 = CONCAT11((char)uVar21,(char)uVar21);
  uVar108 = CONCAT62(uVar67,sVar115);
  auVar419._8_4_ = 0;
  auVar419._0_8_ = uVar108;
  auVar419._12_2_ = uVar158;
  auVar419._14_2_ = uVar158;
  uVar158 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar418._12_4_ = auVar419._12_4_;
  auVar418._8_2_ = 0;
  auVar418._0_8_ = uVar108;
  auVar418._10_2_ = uVar158;
  auVar417._10_6_ = auVar418._10_6_;
  auVar417._8_2_ = uVar158;
  auVar417._0_8_ = uVar108;
  uVar158 = (undefined2)uVar67;
  auVar78._4_8_ = auVar417._8_8_;
  auVar78._2_2_ = uVar158;
  auVar78._0_2_ = uVar158;
  fVar412 = (float)((int)sVar115 >> 8);
  fVar422 = (float)(auVar78._0_4_ >> 0x18);
  fVar427 = (float)(auVar417._8_4_ >> 0x18);
  uVar157 = (undefined1)((uint)uVar22 >> 0x18);
  uVar158 = CONCAT11(uVar157,uVar157);
  uVar157 = (undefined1)((uint)uVar22 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar158,uVar157),CONCAT14(uVar157,uVar22));
  uVar157 = (undefined1)((uint)uVar22 >> 8);
  uVar67 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar157),uVar157);
  sVar115 = CONCAT11((char)uVar22,(char)uVar22);
  uVar108 = CONCAT62(uVar67,sVar115);
  auVar338._8_4_ = 0;
  auVar338._0_8_ = uVar108;
  auVar338._12_2_ = uVar158;
  auVar338._14_2_ = uVar158;
  uVar158 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar337._12_4_ = auVar338._12_4_;
  auVar337._8_2_ = 0;
  auVar337._0_8_ = uVar108;
  auVar337._10_2_ = uVar158;
  auVar336._10_6_ = auVar337._10_6_;
  auVar336._8_2_ = uVar158;
  auVar336._0_8_ = uVar108;
  uVar158 = (undefined2)uVar67;
  auVar79._4_8_ = auVar336._8_8_;
  auVar79._2_2_ = uVar158;
  auVar79._0_2_ = uVar158;
  fVar333 = (float)((int)sVar115 >> 8);
  fVar347 = (float)(auVar79._0_4_ >> 0x18);
  fVar350 = (float)(auVar336._8_4_ >> 0x18);
  uVar157 = (undefined1)((uint)uVar16 >> 0x18);
  uVar158 = CONCAT11(uVar157,uVar157);
  uVar157 = (undefined1)((uint)uVar16 >> 0x10);
  uVar6 = CONCAT35(CONCAT21(uVar158,uVar157),CONCAT14(uVar157,uVar16));
  uVar157 = (undefined1)((uint)uVar16 >> 8);
  uVar67 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar157),uVar157);
  sVar115 = CONCAT11((char)uVar16,(char)uVar16);
  uVar108 = CONCAT62(uVar67,sVar115);
  auVar451._8_4_ = 0;
  auVar451._0_8_ = uVar108;
  auVar451._12_2_ = uVar158;
  auVar451._14_2_ = uVar158;
  uVar158 = (undefined2)((ulong)uVar6 >> 0x20);
  auVar450._12_4_ = auVar451._12_4_;
  auVar450._8_2_ = 0;
  auVar450._0_8_ = uVar108;
  auVar450._10_2_ = uVar158;
  auVar449._10_6_ = auVar450._10_6_;
  auVar449._8_2_ = uVar158;
  auVar449._0_8_ = uVar108;
  uVar158 = (undefined2)uVar67;
  auVar80._4_8_ = auVar449._8_8_;
  auVar80._2_2_ = uVar158;
  auVar80._0_2_ = uVar158;
  fVar116 = (float)((int)sVar115 >> 8);
  fVar159 = (float)(auVar80._0_4_ >> 0x18);
  fVar160 = (float)(auVar449._8_4_ >> 0x18);
  fVar447 = fVar383 * fVar239 + fVar396 * (float)iVar202 + fVar401 * (float)iVar232;
  fVar454 = fVar383 * fVar248 + fVar396 * fVar296 + fVar401 * fVar382;
  fVar456 = fVar383 * fVar249 + fVar396 * (float)auVar205._8_4_ + fVar401 * (float)auVar206._8_4_;
  fVar458 = fVar383 * (float)(auVar243._12_4_ >> 0x18) +
            fVar396 * (float)auVar211._12_4_ + fVar401 * (float)auVar215._12_4_;
  fVar384 = fVar383 * fVar204 + fVar396 * (float)iVar233 + fVar238;
  fVar397 = fVar383 * fVar235 + fVar396 * fVar314 + fVar247;
  fVar402 = fVar383 * fVar237 + fVar396 * (float)auVar207._8_4_ + auVar240._8_4_;
  fVar407 = fVar383 * (float)(auVar254._12_4_ >> 0x18) +
            fVar396 * (float)auVar219._12_4_ + auVar241._12_4_;
  fVar238 = fVar383 * fVar412 + fVar396 * fVar333 + fVar401 * fVar116;
  fVar247 = fVar383 * fVar422 + fVar396 * fVar347 + fVar401 * fVar159;
  fVar291 = fVar383 * fVar427 + fVar396 * fVar350 + fVar401 * fVar160;
  fVar383 = fVar383 * (float)(auVar418._12_4_ >> 0x18) +
            fVar396 * (float)(auVar337._12_4_ >> 0x18) + fVar401 * (float)(auVar450._12_4_ >> 0x18);
  uVar6 = *(undefined8 *)(prim + uVar102 * 7 + 6);
  uVar7 = *(undefined8 *)(prim + uVar102 * 0xb + 6);
  uVar8 = *(undefined8 *)(prim + uVar102 * 9 + 6);
  uVar9 = *(undefined8 *)(prim + uVar102 * 0xd + 6);
  uVar108 = *(ulong *)(prim + uVar102 * 0x12 + 6);
  fVar396 = fVar239 * fVar161 + (float)iVar202 * fVar195 + (float)iVar232 * fVar198;
  fVar382 = fVar248 * fVar161 + fVar296 * fVar195 + fVar382 * fVar198;
  fVar250 = fVar249 * fVar161 + (float)auVar205._8_4_ * fVar195 + (float)auVar206._8_4_ * fVar198;
  fVar251 = (float)(auVar243._12_4_ >> 0x18) * fVar161 +
            (float)auVar211._12_4_ * fVar195 + (float)auVar215._12_4_ * fVar198;
  fVar296 = fVar204 * fVar161 + (float)iVar233 * fVar195 + fVar318 * fVar198;
  fVar314 = fVar235 * fVar161 + fVar314 * fVar195 + fVar328 * fVar198;
  fVar318 = fVar237 * fVar161 + (float)auVar207._8_4_ * fVar195 + fVar330 * fVar198;
  fVar328 = (float)(auVar254._12_4_ >> 0x18) * fVar161 +
            (float)auVar219._12_4_ * fVar195 + (float)(auVar221._12_4_ >> 0x18) * fVar198;
  fVar412 = fVar161 * fVar412 + fVar195 * fVar333 + fVar198 * fVar116;
  fVar422 = fVar161 * fVar422 + fVar195 * fVar347 + fVar198 * fVar159;
  fVar427 = fVar161 * fVar427 + fVar195 * fVar350 + fVar198 * fVar160;
  fVar445 = fVar161 * (float)(auVar418._12_4_ >> 0x18) +
            fVar195 * (float)(auVar337._12_4_ >> 0x18) + fVar198 * (float)(auVar450._12_4_ >> 0x18);
  fVar401 = (float)DAT_01f4bd50;
  fVar116 = DAT_01f4bd50._4_4_;
  fVar159 = DAT_01f4bd50._8_4_;
  fVar160 = DAT_01f4bd50._12_4_;
  uVar111 = -(uint)(fVar401 <= ABS(fVar447));
  uVar112 = -(uint)(fVar116 <= ABS(fVar454));
  uVar113 = -(uint)(fVar159 <= ABS(fVar456));
  uVar114 = -(uint)(fVar160 <= ABS(fVar458));
  auVar452._0_4_ = (uint)fVar447 & uVar111;
  auVar452._4_4_ = (uint)fVar454 & uVar112;
  auVar452._8_4_ = (uint)fVar456 & uVar113;
  auVar452._12_4_ = (uint)fVar458 & uVar114;
  auVar119._0_4_ = ~uVar111 & (uint)fVar401;
  auVar119._4_4_ = ~uVar112 & (uint)fVar116;
  auVar119._8_4_ = ~uVar113 & (uint)fVar159;
  auVar119._12_4_ = ~uVar114 & (uint)fVar160;
  auVar119 = auVar119 | auVar452;
  uVar111 = -(uint)(fVar401 <= ABS(fVar384));
  uVar112 = -(uint)(fVar116 <= ABS(fVar397));
  uVar113 = -(uint)(fVar159 <= ABS(fVar402));
  uVar114 = -(uint)(fVar160 <= ABS(fVar407));
  auVar390._0_4_ = (uint)fVar384 & uVar111;
  auVar390._4_4_ = (uint)fVar397 & uVar112;
  auVar390._8_4_ = (uint)fVar402 & uVar113;
  auVar390._12_4_ = (uint)fVar407 & uVar114;
  auVar301._0_4_ = ~uVar111 & (uint)fVar401;
  auVar301._4_4_ = ~uVar112 & (uint)fVar116;
  auVar301._8_4_ = ~uVar113 & (uint)fVar159;
  auVar301._12_4_ = ~uVar114 & (uint)fVar160;
  auVar301 = auVar301 | auVar390;
  uVar111 = -(uint)(fVar401 <= ABS(fVar238));
  uVar112 = -(uint)(fVar116 <= ABS(fVar247));
  uVar113 = -(uint)(fVar159 <= ABS(fVar291));
  uVar114 = -(uint)(fVar160 <= ABS(fVar383));
  auVar278._0_4_ = (uint)fVar238 & uVar111;
  auVar278._4_4_ = (uint)fVar247 & uVar112;
  auVar278._8_4_ = (uint)fVar291 & uVar113;
  auVar278._12_4_ = (uint)fVar383 & uVar114;
  auVar391._0_4_ = ~uVar111 & (uint)fVar401;
  auVar391._4_4_ = ~uVar112 & (uint)fVar116;
  auVar391._8_4_ = ~uVar113 & (uint)fVar159;
  auVar391._12_4_ = ~uVar114 & (uint)fVar160;
  auVar391 = auVar391 | auVar278;
  auVar254 = rcpps(_DAT_01f4bd50,auVar119);
  auVar255._0_4_ = auVar254._0_4_;
  auVar341._0_4_ = auVar119._0_4_ * auVar255._0_4_;
  fVar330 = auVar254._4_4_;
  auVar341._4_4_ = auVar119._4_4_ * fVar330;
  fVar333 = auVar254._8_4_;
  auVar341._8_4_ = auVar119._8_4_ * fVar333;
  fVar347 = auVar254._12_4_;
  auVar341._12_4_ = auVar119._12_4_ * fVar347;
  fVar384 = (1.0 - auVar341._0_4_) * auVar255._0_4_ + auVar255._0_4_;
  fVar330 = (1.0 - auVar341._4_4_) * fVar330 + fVar330;
  fVar333 = (1.0 - auVar341._8_4_) * fVar333 + fVar333;
  fVar347 = (1.0 - auVar341._12_4_) * fVar347 + fVar347;
  auVar120 = rcpps(auVar341,auVar301);
  fVar401 = auVar120._0_4_;
  auVar302._0_4_ = auVar301._0_4_ * fVar401;
  fVar116 = auVar120._4_4_;
  fVar195 = auVar301._4_4_ * fVar116;
  auVar300._0_8_ = CONCAT44(fVar195,auVar302._0_4_);
  fVar237 = auVar120._8_4_;
  auVar300._8_4_ = auVar301._8_4_ * fVar237;
  fVar291 = auVar120._12_4_;
  fVar401 = (1.0 - auVar302._0_4_) * fVar401 + fVar401;
  fVar116 = (1.0 - fVar195) * fVar116 + fVar116;
  fVar237 = (1.0 - auVar300._8_4_) * fVar237 + fVar237;
  fVar291 = (1.0 - auVar301._12_4_ * fVar291) * fVar291 + fVar291;
  auVar120 = rcpps(auVar120,auVar391);
  auVar121._0_4_ = auVar120._0_4_;
  fVar159 = auVar120._4_4_;
  fVar238 = auVar120._8_4_;
  fVar383 = auVar120._12_4_;
  uVar10 = *(undefined8 *)(prim + uVar102 * 0x16 + 6);
  fVar350 = (1.0 - auVar391._0_4_ * auVar121._0_4_) * auVar121._0_4_ + auVar121._0_4_;
  fVar159 = (1.0 - auVar391._4_4_ * fVar159) * fVar159 + fVar159;
  fVar238 = (1.0 - auVar391._8_4_ * fVar238) * fVar238 + fVar238;
  fVar383 = (1.0 - auVar391._12_4_ * fVar383) * fVar383 + fVar383;
  local_538.lower._0_2_ = (short)uVar6;
  local_538.lower._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
  local_538.upper._0_2_ = (undefined2)((ulong)uVar6 >> 0x20);
  local_538.upper._2_2_ = (undefined2)((ulong)uVar6 >> 0x30);
  auVar124._0_12_ = auVar120._0_12_;
  auVar124._12_2_ = auVar120._6_2_;
  auVar124._14_2_ = local_538.upper._2_2_;
  auVar123._12_4_ = auVar124._12_4_;
  auVar123._0_10_ = auVar120._0_10_;
  auVar123._10_2_ = local_538.upper._0_2_;
  auVar122._10_6_ = auVar123._10_6_;
  auVar122._0_8_ = auVar120._0_8_;
  auVar122._8_2_ = auVar120._4_2_;
  auVar121._8_8_ = auVar122._8_8_;
  auVar121._6_2_ = local_538.lower._2_2_;
  auVar121._4_2_ = auVar120._2_2_;
  auVar125._0_4_ = (float)(int)local_538.lower._0_2_;
  fVar160 = (float)(auVar121._4_4_ >> 0x10);
  auVar117._0_8_ = CONCAT44(fVar160,auVar125._0_4_);
  auVar117._8_4_ = (float)(auVar122._8_4_ >> 0x10);
  auVar258._0_12_ = auVar254._0_12_;
  auVar258._12_2_ = auVar254._6_2_;
  auVar258._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar257._12_4_ = auVar258._12_4_;
  auVar257._0_10_ = auVar254._0_10_;
  auVar257._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar256._10_6_ = auVar257._10_6_;
  auVar256._0_8_ = auVar254._0_8_;
  auVar256._8_2_ = auVar254._4_2_;
  auVar255._8_8_ = auVar256._8_8_;
  auVar255._6_2_ = (short)((ulong)uVar7 >> 0x10);
  auVar255._4_2_ = auVar254._2_2_;
  auVar128._12_2_ = (short)((uint)fVar160 >> 0x10);
  auVar128._0_12_ = auVar117;
  auVar128._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._0_10_ = auVar117._0_10_;
  auVar127._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = SUB42(fVar160,0);
  auVar126._0_8_ = auVar117._0_8_;
  auVar125._8_8_ = auVar126._8_8_;
  auVar125._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar125._4_2_ = (short)((uint)auVar125._0_4_ >> 0x10);
  auVar129._0_4_ = (float)(int)(short)uVar8;
  fVar161 = (float)(auVar125._4_4_ >> 0x10);
  auVar118._0_8_ = CONCAT44(fVar161,auVar129._0_4_);
  auVar118._8_4_ = (float)(auVar126._8_4_ >> 0x10);
  auVar305._12_2_ = (short)((uint)fVar195 >> 0x10);
  auVar305._0_12_ = auVar300;
  auVar305._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar304._12_4_ = auVar305._12_4_;
  auVar304._0_10_ = auVar300._0_10_;
  auVar304._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar303._10_6_ = auVar304._10_6_;
  auVar303._8_2_ = SUB42(fVar195,0);
  auVar303._0_8_ = auVar300._0_8_;
  auVar302._8_8_ = auVar303._8_8_;
  auVar302._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar302._4_2_ = (short)((uint)auVar302._0_4_ >> 0x10);
  uVar197 = (undefined2)(uVar108 >> 0x30);
  auVar132._12_2_ = (short)((uint)fVar161 >> 0x10);
  auVar132._0_12_ = auVar118;
  auVar132._14_2_ = uVar197;
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._0_10_ = auVar118._0_10_;
  uVar194 = (undefined2)(uVar108 >> 0x20);
  auVar131._10_2_ = uVar194;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = SUB42(fVar161,0);
  auVar130._0_8_ = auVar118._0_8_;
  auVar129._8_8_ = auVar130._8_8_;
  uVar158 = (undefined2)(uVar108 >> 0x10);
  auVar129._6_2_ = uVar158;
  auVar129._4_2_ = (short)((uint)auVar129._0_4_ >> 0x10);
  fVar195 = (float)(auVar129._4_4_ >> 0x10);
  fVar239 = (float)(auVar130._8_4_ >> 0x10);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar108;
  auVar164._12_2_ = uVar197;
  auVar164._14_2_ = (short)((ulong)uVar10 >> 0x30);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar108;
  auVar163._10_2_ = (short)((ulong)uVar10 >> 0x20);
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar194;
  auVar162._0_8_ = uVar108;
  auVar81._4_8_ = auVar162._8_8_;
  auVar81._2_2_ = (short)((ulong)uVar10 >> 0x10);
  auVar81._0_2_ = uVar158;
  uVar103 = *(ulong *)(prim + uVar102 * 0x14 + 6);
  uVar158 = (undefined2)(uVar103 >> 0x30);
  auVar135._8_4_ = 0;
  auVar135._0_8_ = uVar103;
  auVar135._12_2_ = uVar158;
  auVar135._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar103 >> 0x20);
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._8_2_ = 0;
  auVar134._0_8_ = uVar103;
  auVar134._10_2_ = uVar158;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._8_2_ = uVar158;
  auVar133._0_8_ = uVar103;
  uVar158 = (undefined2)(uVar103 >> 0x10);
  auVar82._4_8_ = auVar133._8_8_;
  auVar82._2_2_ = uVar158;
  auVar82._0_2_ = uVar158;
  fVar198 = (float)(auVar82._0_4_ >> 0x10);
  fVar247 = (float)(auVar133._8_4_ >> 0x10);
  uVar109 = *(ulong *)(prim + uVar102 * 0x18 + 6);
  uVar158 = (undefined2)(uVar109 >> 0x30);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar109;
  auVar167._12_2_ = uVar158;
  auVar167._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar109 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar109;
  auVar166._10_2_ = uVar158;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar158;
  auVar165._0_8_ = uVar109;
  uVar158 = (undefined2)(uVar109 >> 0x10);
  auVar83._4_8_ = auVar165._8_8_;
  auVar83._2_2_ = uVar158;
  auVar83._0_2_ = uVar158;
  uVar11 = *(ulong *)(prim + uVar102 * 0x1d + 6);
  uVar158 = (undefined2)(uVar11 >> 0x30);
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar11;
  auVar138._12_2_ = uVar158;
  auVar138._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar11 >> 0x20);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar11;
  auVar137._10_2_ = uVar158;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = uVar158;
  auVar136._0_8_ = uVar11;
  uVar158 = (undefined2)(uVar11 >> 0x10);
  auVar84._4_8_ = auVar136._8_8_;
  auVar84._2_2_ = uVar158;
  auVar84._0_2_ = uVar158;
  fVar204 = (float)(auVar84._0_4_ >> 0x10);
  fVar248 = (float)(auVar136._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar102 * 0x21 + 6);
  uVar158 = (undefined2)(uVar12 >> 0x30);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar12;
  auVar170._12_2_ = uVar158;
  auVar170._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar12 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar12;
  auVar169._10_2_ = uVar158;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar158;
  auVar168._0_8_ = uVar12;
  uVar158 = (undefined2)(uVar12 >> 0x10);
  auVar85._4_8_ = auVar168._8_8_;
  auVar85._2_2_ = uVar158;
  auVar85._0_2_ = uVar158;
  uVar13 = *(ulong *)(prim + uVar102 * 0x1f + 6);
  uVar158 = (undefined2)(uVar13 >> 0x30);
  auVar141._8_4_ = 0;
  auVar141._0_8_ = uVar13;
  auVar141._12_2_ = uVar158;
  auVar141._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar13 >> 0x20);
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar13;
  auVar140._10_2_ = uVar158;
  auVar139._10_6_ = auVar140._10_6_;
  auVar139._8_2_ = uVar158;
  auVar139._0_8_ = uVar13;
  uVar158 = (undefined2)(uVar13 >> 0x10);
  auVar86._4_8_ = auVar139._8_8_;
  auVar86._2_2_ = uVar158;
  auVar86._0_2_ = uVar158;
  fVar235 = (float)(auVar86._0_4_ >> 0x10);
  fVar249 = (float)(auVar139._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar102 * 0x23 + 6);
  uVar158 = (undefined2)(uVar14 >> 0x30);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar14;
  auVar173._12_2_ = uVar158;
  auVar173._14_2_ = uVar158;
  uVar158 = (undefined2)(uVar14 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar14;
  auVar172._10_2_ = uVar158;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar158;
  auVar171._0_8_ = uVar14;
  uVar158 = (undefined2)(uVar14 >> 0x10);
  auVar87._4_8_ = auVar171._8_8_;
  auVar87._2_2_ = uVar158;
  auVar87._0_2_ = uVar158;
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar259._0_8_ =
       CONCAT44(((((float)(auVar255._4_4_ >> 0x10) - fVar160) * fVar203 + fVar160) - fVar382) *
                fVar330,((((float)(int)(short)uVar7 - auVar125._0_4_) * fVar203 + auVar125._0_4_) -
                        fVar396) * fVar384);
  auVar259._8_4_ =
       ((((float)(auVar256._8_4_ >> 0x10) - auVar117._8_4_) * fVar203 + auVar117._8_4_) - fVar250) *
       fVar333;
  auVar259._12_4_ =
       ((((float)(auVar257._12_4_ >> 0x10) - (float)(auVar123._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar123._12_4_ >> 0x10)) - fVar251) * fVar347;
  auVar306._0_4_ =
       ((((float)(int)(short)uVar9 - auVar129._0_4_) * fVar203 + auVar129._0_4_) - fVar396) *
       fVar384;
  auVar306._4_4_ =
       ((((float)(auVar302._4_4_ >> 0x10) - fVar161) * fVar203 + fVar161) - fVar382) * fVar330;
  auVar306._8_4_ =
       ((((float)(auVar303._8_4_ >> 0x10) - auVar118._8_4_) * fVar203 + auVar118._8_4_) - fVar250) *
       fVar333;
  auVar306._12_4_ =
       ((((float)(auVar304._12_4_ >> 0x10) - (float)(auVar127._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar127._12_4_ >> 0x10)) - fVar251) * fVar347;
  auVar339._0_8_ =
       CONCAT44(((((float)(auVar81._0_4_ >> 0x10) - fVar195) * fVar203 + fVar195) - fVar314) *
                fVar116,((((float)(int)(short)uVar10 - (float)(int)(short)uVar108) * fVar203 +
                         (float)(int)(short)uVar108) - fVar296) * fVar401);
  auVar339._8_4_ =
       ((((float)(auVar162._8_4_ >> 0x10) - fVar239) * fVar203 + fVar239) - fVar318) * fVar237;
  auVar339._12_4_ =
       ((((float)(auVar163._12_4_ >> 0x10) - (float)(auVar131._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar131._12_4_ >> 0x10)) - fVar328) * fVar291;
  auVar360._0_4_ =
       ((((float)(int)(short)uVar109 - (float)(int)(short)uVar103) * fVar203 +
        (float)(int)(short)uVar103) - fVar296) * fVar401;
  auVar360._4_4_ =
       ((((float)(auVar83._0_4_ >> 0x10) - fVar198) * fVar203 + fVar198) - fVar314) * fVar116;
  auVar360._8_4_ =
       ((((float)(auVar165._8_4_ >> 0x10) - fVar247) * fVar203 + fVar247) - fVar318) * fVar237;
  auVar360._12_4_ =
       ((((float)(auVar166._12_4_ >> 0x10) - (float)(auVar134._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar134._12_4_ >> 0x10)) - fVar328) * fVar291;
  auVar376._0_8_ =
       CONCAT44(((((float)(auVar85._0_4_ >> 0x10) - fVar204) * fVar203 + fVar204) - fVar422) *
                fVar159,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar203 +
                         (float)(int)(short)uVar11) - fVar412) * fVar350);
  auVar376._8_4_ =
       ((((float)(auVar168._8_4_ >> 0x10) - fVar248) * fVar203 + fVar248) - fVar427) * fVar238;
  auVar376._12_4_ =
       ((((float)(auVar169._12_4_ >> 0x10) - (float)(auVar137._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar137._12_4_ >> 0x10)) - fVar445) * fVar383;
  auVar392._0_4_ =
       ((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar203 +
        (float)(int)(short)uVar13) - fVar412) * fVar350;
  auVar392._4_4_ =
       ((((float)(auVar87._0_4_ >> 0x10) - fVar235) * fVar203 + fVar235) - fVar422) * fVar159;
  auVar392._8_4_ =
       ((((float)(auVar171._8_4_ >> 0x10) - fVar249) * fVar203 + fVar249) - fVar427) * fVar238;
  auVar392._12_4_ =
       ((((float)(auVar172._12_4_ >> 0x10) - (float)(auVar140._12_4_ >> 0x10)) * fVar203 +
        (float)(auVar140._12_4_ >> 0x10)) - fVar445) * fVar383;
  auVar223._8_4_ = auVar259._8_4_;
  auVar223._0_8_ = auVar259._0_8_;
  auVar223._12_4_ = auVar259._12_4_;
  auVar254 = minps(auVar223,auVar306);
  auVar142._8_4_ = auVar339._8_4_;
  auVar142._0_8_ = auVar339._0_8_;
  auVar142._12_4_ = auVar339._12_4_;
  auVar120 = minps(auVar142,auVar360);
  auVar254 = maxps(auVar254,auVar120);
  auVar143._8_4_ = auVar376._8_4_;
  auVar143._0_8_ = auVar376._0_8_;
  auVar143._12_4_ = auVar376._12_4_;
  auVar120 = minps(auVar143,auVar392);
  auVar174._4_4_ = uVar5;
  auVar174._0_4_ = uVar5;
  auVar174._8_4_ = uVar5;
  auVar174._12_4_ = uVar5;
  auVar120 = maxps(auVar120,auVar174);
  auVar120 = maxps(auVar254,auVar120);
  fVar401 = auVar120._0_4_ * 0.99999964;
  fVar116 = auVar120._4_4_ * 0.99999964;
  fVar159 = auVar120._8_4_ * 0.99999964;
  fVar160 = auVar120._12_4_ * 0.99999964;
  auVar120 = maxps(auVar259,auVar306);
  auVar254 = maxps(auVar339,auVar360);
  auVar120 = minps(auVar120,auVar254);
  auVar254 = maxps(auVar376,auVar392);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar144._4_4_ = uVar5;
  auVar144._0_4_ = uVar5;
  auVar144._8_4_ = uVar5;
  auVar144._12_4_ = uVar5;
  auVar254 = minps(auVar254,auVar144);
  auVar120 = minps(auVar120,auVar254);
  auVar175._0_4_ = -(uint)(PVar15 != (Primitive)0x0 && fVar401 <= auVar120._0_4_ * 1.0000004);
  auVar175._4_4_ = -(uint)(1 < (byte)PVar15 && fVar116 <= auVar120._4_4_ * 1.0000004);
  auVar175._8_4_ = -(uint)(2 < (byte)PVar15 && fVar159 <= auVar120._8_4_ * 1.0000004);
  auVar175._12_4_ = -(uint)(3 < (byte)PVar15 && fVar160 <= auVar120._12_4_ * 1.0000004);
  uVar111 = movmskps((int)(uVar102 * 0x23),auVar175);
  local_390 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar30 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar31 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar32 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_388 = prim;
LAB_003d21f1:
  uVar108 = (ulong)uVar111;
  if (uVar108 == 0) {
    return;
  }
  lVar106 = 0;
  if (uVar108 != 0) {
    for (; (uVar111 >> lVar106 & 1) == 0; lVar106 = lVar106 + 1) {
    }
  }
  uVar111 = *(uint *)(local_388 + 2);
  uVar112 = *(uint *)(local_388 + lVar106 * 4 + 6);
  pGVar23 = (context->scene->geometries).items[uVar111].ptr;
  fVar161 = pGVar23->fnumTimeSegments;
  fVar195 = (pGVar23->time_range).lower;
  fVar198 = ((*(float *)(ray + k * 4 + 0x70) - fVar195) / ((pGVar23->time_range).upper - fVar195)) *
            fVar161;
  fVar195 = floorf(fVar198);
  fVar161 = fVar161 + -1.0;
  if (fVar161 <= fVar195) {
    fVar195 = fVar161;
  }
  fVar161 = 0.0;
  if (0.0 <= fVar195) {
    fVar161 = fVar195;
  }
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                            (ulong)uVar112 *
                            pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar107 = (long)(int)fVar161 * 0x38;
  lVar25 = *(long *)(_Var24 + lVar107);
  lVar26 = *(long *)(_Var24 + 0x10 + lVar107);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar103);
  fVar195 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar235 = pfVar3[2];
  fVar237 = pfVar3[3];
  lVar106 = uVar103 + 1;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar106);
  fVar238 = *pfVar3;
  fVar239 = pfVar3[1];
  fVar247 = pfVar3[2];
  fVar248 = pfVar3[3];
  lVar1 = uVar103 + 2;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar1);
  fVar249 = *pfVar3;
  fVar291 = pfVar3[1];
  fVar383 = pfVar3[2];
  fVar203 = pfVar3[3];
  lVar2 = uVar103 + 3;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar2);
  fVar296 = *pfVar3;
  fVar314 = pfVar3[1];
  fVar318 = pfVar3[2];
  fVar328 = pfVar3[3];
  lVar25 = *(long *)&pGVar23[4].fnumTimeSegments;
  lVar26 = *(long *)(lVar25 + lVar107);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar107);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar103);
  fVar396 = *pfVar3;
  fVar382 = pfVar3[1];
  fVar250 = pfVar3[2];
  fVar251 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar106);
  fVar330 = *pfVar3;
  fVar333 = pfVar3[1];
  fVar347 = pfVar3[2];
  fVar350 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  fVar384 = *pfVar3;
  fVar397 = pfVar3[1];
  fVar402 = pfVar3[2];
  fVar407 = pfVar3[3];
  fVar198 = fVar198 - fVar161;
  pfVar3 = (float *)(lVar26 + lVar27 * lVar2);
  fVar161 = *pfVar3;
  fVar412 = pfVar3[1];
  fVar422 = pfVar3[2];
  fVar427 = pfVar3[3];
  fVar413 = (fVar249 * 0.5 + fVar296 * 0.0 + fVar238 * 0.0) - fVar195 * 0.5;
  fVar423 = (fVar291 * 0.5 + fVar314 * 0.0 + fVar239 * 0.0) - fVar204 * 0.5;
  fVar428 = (fVar383 * 0.5 + fVar318 * 0.0 + fVar247 * 0.0) - fVar235 * 0.5;
  fVar432 = (fVar203 * 0.5 + fVar328 * 0.0 + fVar248 * 0.0) - fVar237 * 0.5;
  fVar334 = (fVar384 * 0.5 + fVar161 * 0.0 + fVar330 * 0.0) - fVar396 * 0.5;
  fVar348 = (fVar397 * 0.5 + fVar412 * 0.0 + fVar333 * 0.0) - fVar382 * 0.5;
  fVar351 = (fVar402 * 0.5 + fVar422 * 0.0 + fVar347 * 0.0) - fVar250 * 0.5;
  fVar354 = (fVar407 * 0.5 + fVar427 * 0.0 + fVar350 * 0.0) - fVar251 * 0.5;
  fVar445 = fVar249 * 0.0 + fVar296 * -0.0 + fVar238 + fVar195 * -0.0;
  fVar447 = fVar291 * 0.0 + fVar314 * -0.0 + fVar239 + fVar204 * -0.0;
  fVar454 = fVar383 * 0.0 + fVar318 * -0.0 + fVar247 + fVar235 * -0.0;
  fVar456 = fVar203 * 0.0 + fVar328 * -0.0 + fVar248 + fVar237 * -0.0;
  fVar414 = fVar384 * 0.0 + fVar161 * -0.0 + fVar330 + fVar396 * -0.0;
  fVar424 = fVar397 * 0.0 + fVar412 * -0.0 + fVar333 + fVar382 * -0.0;
  fVar429 = fVar402 * 0.0 + fVar422 * -0.0 + fVar347 + fVar250 * -0.0;
  fVar433 = fVar407 * 0.0 + fVar427 * -0.0 + fVar350 + fVar251 * -0.0;
  fVar252 = fVar296 * -0.0 + fVar249 + fVar238 * 0.0 + fVar195 * -0.0;
  fVar270 = fVar314 * -0.0 + fVar291 + fVar239 * 0.0 + fVar204 * -0.0;
  fVar272 = fVar318 * -0.0 + fVar383 + fVar247 * 0.0 + fVar235 * -0.0;
  fVar275 = fVar328 * -0.0 + fVar203 + fVar248 * 0.0 + fVar237 * -0.0;
  fVar458 = fVar195 * 0.0 + ((fVar296 * 0.5 + fVar249 * 0.0) - fVar238 * 0.5);
  fVar196 = fVar204 * 0.0 + ((fVar314 * 0.5 + fVar291 * 0.0) - fVar239 * 0.5);
  fVar199 = fVar235 * 0.0 + ((fVar318 * 0.5 + fVar383 * 0.0) - fVar247 * 0.5);
  fVar200 = fVar237 * 0.0 + ((fVar328 * 0.5 + fVar203 * 0.0) - fVar248 * 0.5);
  fVar235 = fVar161 * -0.0 + fVar384 + fVar330 * 0.0 + fVar396 * -0.0;
  fVar237 = fVar412 * -0.0 + fVar397 + fVar333 * 0.0 + fVar382 * -0.0;
  fVar238 = fVar422 * -0.0 + fVar402 + fVar347 * 0.0 + fVar250 * -0.0;
  fVar239 = fVar427 * -0.0 + fVar407 + fVar350 * 0.0 + fVar251 * -0.0;
  fVar161 = fVar396 * 0.0 + ((fVar161 * 0.5 + fVar384 * 0.0) - fVar330 * 0.5);
  fVar195 = fVar382 * 0.0 + ((fVar412 * 0.5 + fVar397 * 0.0) - fVar333 * 0.5);
  fVar204 = fVar250 * 0.0 + ((fVar422 * 0.5 + fVar402 * 0.0) - fVar347 * 0.5);
  fVar396 = fVar251 * 0.0 + ((fVar427 * 0.5 + fVar407 * 0.0) - fVar350 * 0.5);
  fVar385 = fVar423 * fVar414 - fVar424 * fVar413;
  fVar398 = fVar428 * fVar424 - fVar429 * fVar423;
  fVar403 = fVar413 * fVar429 - fVar414 * fVar428;
  fVar408 = fVar432 * fVar433 - fVar433 * fVar432;
  fVar333 = fVar423 * fVar334 - fVar348 * fVar413;
  fVar350 = fVar428 * fVar348 - fVar351 * fVar423;
  fVar384 = fVar413 * fVar351 - fVar334 * fVar428;
  fVar412 = fVar196 * fVar235 - fVar237 * fVar458;
  fVar422 = fVar199 * fVar237 - fVar238 * fVar196;
  fVar427 = fVar458 * fVar238 - fVar235 * fVar199;
  fVar429 = fVar200 * fVar239 - fVar239 * fVar200;
  fVar250 = fVar196 * fVar161 - fVar195 * fVar458;
  fVar251 = fVar199 * fVar195 - fVar204 * fVar196;
  fVar330 = fVar458 * fVar204 - fVar161 * fVar199;
  fVar328 = fVar403 * fVar403 + fVar398 * fVar398 + fVar385 * fVar385;
  auVar254 = ZEXT416((uint)fVar328);
  auVar120 = rsqrtss(ZEXT416((uint)fVar328),auVar254);
  fVar161 = auVar120._0_4_;
  fVar348 = fVar161 * 1.5 - fVar161 * fVar161 * fVar328 * 0.5 * fVar161;
  fVar402 = fVar385 * fVar333 + fVar403 * fVar384 + fVar398 * fVar350;
  fVar397 = fVar408 * fVar348;
  auVar120 = rcpss(auVar254,auVar254);
  fVar407 = (2.0 - fVar328 * auVar120._0_4_) * auVar120._0_4_;
  fVar347 = fVar427 * fVar427 + fVar422 * fVar422 + fVar412 * fVar412;
  auVar254 = ZEXT416((uint)fVar347);
  auVar120 = rsqrtss(ZEXT416((uint)fVar347),auVar254);
  fVar161 = auVar120._0_4_;
  fVar433 = fVar161 * 1.5 - fVar161 * fVar161 * fVar347 * 0.5 * fVar161;
  fVar436 = fVar412 * fVar250 + fVar427 * fVar330 + fVar422 * fVar251;
  lVar26 = *(long *)(_Var24 + 0x38 + lVar107);
  lVar27 = *(long *)(_Var24 + 0x48 + lVar107);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar103);
  fVar161 = *pfVar3;
  fVar195 = pfVar3[1];
  fVar204 = pfVar3[2];
  fVar235 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar106);
  fVar237 = *pfVar3;
  fVar238 = pfVar3[1];
  fVar239 = pfVar3[2];
  fVar247 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  fVar248 = *pfVar3;
  fVar249 = pfVar3[1];
  fVar291 = pfVar3[2];
  fVar383 = pfVar3[3];
  auVar120 = rcpss(auVar254,auVar254);
  pfVar3 = (float *)(lVar26 + lVar27 * lVar2);
  fVar203 = *pfVar3;
  fVar296 = pfVar3[1];
  fVar314 = pfVar3[2];
  fVar318 = pfVar3[3];
  fVar382 = fVar429 * fVar433;
  fVar437 = (2.0 - fVar347 * auVar120._0_4_) * auVar120._0_4_;
  fVar415 = fVar456 * fVar398 * fVar348;
  fVar425 = fVar456 * fVar403 * fVar348;
  fVar430 = fVar456 * fVar385 * fVar348;
  fVar434 = fVar456 * fVar397;
  fVar334 = fVar445 - fVar415;
  fVar351 = fVar447 - fVar425;
  fVar414 = fVar454 - fVar430;
  fVar424 = fVar456 - fVar434;
  fVar386 = fVar456 * fVar407 * (fVar328 * fVar350 - fVar402 * fVar398) * fVar348 +
            fVar432 * fVar398 * fVar348;
  fVar399 = fVar456 * fVar407 * (fVar328 * fVar384 - fVar402 * fVar403) * fVar348 +
            fVar432 * fVar403 * fVar348;
  fVar404 = fVar456 * fVar407 * (fVar328 * fVar333 - fVar402 * fVar385) * fVar348 +
            fVar432 * fVar385 * fVar348;
  fVar409 = fVar456 * fVar407 * (fVar328 * (fVar432 * fVar354 - fVar354 * fVar432) -
                                fVar402 * fVar408) * fVar348 + fVar432 * fVar397;
  fVar415 = fVar415 + fVar445;
  fVar425 = fVar425 + fVar447;
  fVar430 = fVar430 + fVar454;
  fVar434 = fVar434 + fVar456;
  fVar445 = fVar275 * fVar422 * fVar433;
  fVar447 = fVar275 * fVar427 * fVar433;
  fVar454 = fVar275 * fVar412 * fVar433;
  fVar456 = fVar275 * fVar382;
  fVar348 = fVar252 - fVar445;
  fVar354 = fVar270 - fVar447;
  fVar385 = fVar272 - fVar454;
  fVar398 = fVar275 - fVar456;
  fVar253 = fVar275 * fVar437 * (fVar347 * fVar251 - fVar436 * fVar422) * fVar433 +
            fVar200 * fVar422 * fVar433;
  fVar271 = fVar275 * fVar437 * (fVar347 * fVar330 - fVar436 * fVar427) * fVar433 +
            fVar200 * fVar427 * fVar433;
  fVar273 = fVar275 * fVar437 * (fVar347 * fVar250 - fVar436 * fVar412) * fVar433 +
            fVar200 * fVar412 * fVar433;
  fVar276 = fVar275 * fVar437 * (fVar347 * (fVar200 * fVar396 - fVar396 * fVar200) -
                                fVar436 * fVar429) * fVar433 + fVar200 * fVar382;
  fVar445 = fVar445 + fVar252;
  fVar447 = fVar447 + fVar270;
  fVar454 = fVar454 + fVar272;
  fVar456 = fVar456 + fVar275;
  fVar436 = (fVar248 * 0.5 + fVar203 * 0.0 + fVar237 * 0.0) - fVar161 * 0.5;
  fVar437 = (fVar249 * 0.5 + fVar296 * 0.0 + fVar238 * 0.0) - fVar195 * 0.5;
  fVar274 = (fVar291 * 0.5 + fVar314 * 0.0 + fVar239 * 0.0) - fVar204 * 0.5;
  fVar277 = (fVar383 * 0.5 + fVar318 * 0.0 + fVar247 * 0.0) - fVar235 * 0.5;
  lVar26 = *(long *)(lVar25 + 0x38 + lVar107);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar107);
  pfVar3 = (float *)(lVar26 + lVar25 * lVar2);
  fVar328 = *pfVar3;
  fVar396 = pfVar3[1];
  fVar382 = pfVar3[2];
  fVar250 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar1 * lVar25);
  fVar251 = *pfVar3;
  fVar330 = pfVar3[1];
  fVar333 = pfVar3[2];
  fVar347 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar106 * lVar25);
  fVar350 = *pfVar3;
  fVar384 = pfVar3[1];
  fVar397 = pfVar3[2];
  fVar402 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + uVar103 * lVar25);
  fVar407 = *pfVar3;
  fVar412 = pfVar3[1];
  fVar422 = pfVar3[2];
  fVar427 = pfVar3[3];
  fVar357 = (fVar251 * 0.5 + fVar328 * 0.0 + fVar350 * 0.0) - fVar407 * 0.5;
  fVar366 = (fVar330 * 0.5 + fVar396 * 0.0 + fVar384 * 0.0) - fVar412 * 0.5;
  fVar369 = (fVar333 * 0.5 + fVar382 * 0.0 + fVar397 * 0.0) - fVar422 * 0.5;
  fVar372 = (fVar347 * 0.5 + fVar250 * 0.0 + fVar402 * 0.0) - fVar427 * 0.5;
  fVar429 = fVar248 * 0.0 + fVar203 * -0.0 + fVar237 + fVar161 * -0.0;
  fVar433 = fVar249 * 0.0 + fVar296 * -0.0 + fVar238 + fVar195 * -0.0;
  fVar403 = fVar291 * 0.0 + fVar314 * -0.0 + fVar239 + fVar204 * -0.0;
  fVar408 = fVar383 * 0.0 + fVar318 * -0.0 + fVar247 + fVar235 * -0.0;
  fVar252 = fVar203 * -0.0 + fVar248 + fVar237 * 0.0 + fVar161 * -0.0;
  fVar270 = fVar296 * -0.0 + fVar249 + fVar238 * 0.0 + fVar195 * -0.0;
  fVar272 = fVar314 * -0.0 + fVar291 + fVar239 * 0.0 + fVar204 * -0.0;
  fVar275 = fVar318 * -0.0 + fVar383 + fVar247 * 0.0 + fVar235 * -0.0;
  fVar161 = fVar161 * 0.0 + ((fVar203 * 0.5 + fVar248 * 0.0) - fVar237 * 0.5);
  fVar195 = fVar195 * 0.0 + ((fVar296 * 0.5 + fVar249 * 0.0) - fVar238 * 0.5);
  fVar237 = fVar204 * 0.0 + ((fVar314 * 0.5 + fVar291 * 0.0) - fVar239 * 0.5);
  fVar238 = fVar235 * 0.0 + ((fVar318 * 0.5 + fVar383 * 0.0) - fVar247 * 0.5);
  fVar239 = fVar251 * 0.0 + fVar328 * -0.0 + fVar350 + fVar407 * -0.0;
  fVar248 = fVar330 * 0.0 + fVar396 * -0.0 + fVar384 + fVar412 * -0.0;
  fVar249 = fVar333 * 0.0 + fVar382 * -0.0 + fVar397 + fVar422 * -0.0;
  fVar296 = fVar347 * 0.0 + fVar250 * -0.0 + fVar402 + fVar427 * -0.0;
  fVar247 = fVar328 * -0.0 + fVar251 + fVar350 * 0.0 + fVar407 * -0.0;
  fVar291 = fVar396 * -0.0 + fVar330 + fVar384 * 0.0 + fVar412 * -0.0;
  fVar383 = fVar382 * -0.0 + fVar333 + fVar397 * 0.0 + fVar422 * -0.0;
  fVar203 = fVar250 * -0.0 + fVar347 + fVar402 * 0.0 + fVar427 * -0.0;
  fVar318 = fVar407 * 0.0 + ((fVar328 * 0.5 + fVar251 * 0.0) - fVar350 * 0.5);
  fVar396 = fVar412 * 0.0 + ((fVar396 * 0.5 + fVar330 * 0.0) - fVar384 * 0.5);
  fVar251 = fVar422 * 0.0 + ((fVar382 * 0.5 + fVar333 * 0.0) - fVar397 * 0.5);
  fVar422 = fVar427 * 0.0 + ((fVar250 * 0.5 + fVar347 * 0.0) - fVar402 * 0.5);
  fVar330 = fVar437 * fVar239 - fVar248 * fVar436;
  fVar333 = fVar274 * fVar248 - fVar249 * fVar437;
  fVar407 = fVar436 * fVar249 - fVar239 * fVar274;
  fVar412 = fVar277 * fVar296 - fVar296 * fVar277;
  fVar239 = fVar437 * fVar357 - fVar366 * fVar436;
  fVar248 = fVar274 * fVar366 - fVar369 * fVar437;
  fVar249 = fVar436 * fVar369 - fVar357 * fVar274;
  fVar296 = fVar195 * fVar247 - fVar291 * fVar161;
  fVar314 = fVar237 * fVar291 - fVar383 * fVar195;
  fVar328 = fVar161 * fVar383 - fVar247 * fVar237;
  fVar382 = fVar238 * fVar203 - fVar203 * fVar238;
  fVar291 = fVar195 * fVar318 - fVar396 * fVar161;
  fVar383 = fVar237 * fVar396 - fVar251 * fVar195;
  fVar203 = fVar161 * fVar251 - fVar318 * fVar237;
  fVar251 = fVar407 * fVar407 + fVar333 * fVar333 + fVar330 * fVar330;
  auVar120 = ZEXT416((uint)fVar251);
  auVar254 = rsqrtss(ZEXT416((uint)fVar251),auVar120);
  fVar247 = auVar254._0_4_;
  fVar347 = fVar247 * 1.5 - fVar247 * fVar247 * fVar251 * 0.5 * fVar247;
  fVar427 = fVar330 * fVar239 + fVar407 * fVar249 + fVar333 * fVar248;
  auVar120 = rcpss(auVar120,auVar120);
  fVar247 = (2.0 - fVar251 * auVar120._0_4_) * auVar120._0_4_;
  fVar250 = fVar412 * fVar347;
  fVar357 = fVar328 * fVar328 + fVar314 * fVar314 + fVar296 * fVar296;
  auVar120 = ZEXT416((uint)fVar357);
  auVar254 = rsqrtss(ZEXT416((uint)fVar357),auVar120);
  fVar318 = auVar254._0_4_;
  fVar369 = fVar318 * 1.5 - fVar318 * fVar318 * fVar357 * 0.5 * fVar318;
  fVar387 = fVar296 * fVar291 + fVar328 * fVar203 + fVar314 * fVar383;
  auVar120 = rcpss(auVar120,auVar120);
  fVar388 = (2.0 - fVar357 * auVar120._0_4_) * auVar120._0_4_;
  fVar366 = fVar382 * fVar369;
  fVar350 = fVar408 * fVar333 * fVar347;
  fVar384 = fVar408 * fVar407 * fVar347;
  fVar397 = fVar408 * fVar330 * fVar347;
  fVar402 = fVar408 * fVar250;
  fVar318 = fVar408 * fVar247 * (fVar251 * fVar248 - fVar427 * fVar333) * fVar347 +
            fVar277 * fVar333 * fVar347;
  fVar396 = fVar408 * fVar247 * (fVar251 * fVar249 - fVar427 * fVar407) * fVar347 +
            fVar277 * fVar407 * fVar347;
  fVar333 = fVar408 * fVar247 * (fVar251 * fVar239 - fVar427 * fVar330) * fVar347 +
            fVar277 * fVar330 * fVar347;
  fVar347 = fVar408 * fVar247 * (fVar251 * (fVar277 * fVar372 - fVar372 * fVar277) -
                                fVar427 * fVar412) * fVar347 + fVar277 * fVar250;
  fVar250 = fVar429 - fVar350;
  fVar251 = fVar433 - fVar384;
  fVar330 = fVar403 - fVar397;
  fVar407 = fVar408 - fVar402;
  fVar350 = fVar350 + fVar429;
  fVar384 = fVar384 + fVar433;
  fVar397 = fVar397 + fVar403;
  fVar402 = fVar402 + fVar408;
  fVar239 = fVar275 * fVar314 * fVar369;
  fVar247 = fVar275 * fVar328 * fVar369;
  fVar248 = fVar275 * fVar296 * fVar369;
  fVar249 = fVar275 * fVar366;
  fVar412 = fVar275 * fVar388 * (fVar357 * fVar383 - fVar387 * fVar314) * fVar369 +
            fVar238 * fVar314 * fVar369;
  fVar427 = fVar275 * fVar388 * (fVar357 * fVar203 - fVar387 * fVar328) * fVar369 +
            fVar238 * fVar328 * fVar369;
  fVar429 = fVar275 * fVar388 * (fVar357 * fVar291 - fVar387 * fVar296) * fVar369 +
            fVar238 * fVar296 * fVar369;
  fVar433 = fVar275 * fVar388 * (fVar357 * (fVar238 * fVar422 - fVar422 * fVar238) -
                                fVar387 * fVar382) * fVar369 + fVar238 * fVar366;
  fVar291 = fVar252 - fVar239;
  fVar383 = fVar270 - fVar247;
  fVar203 = fVar272 - fVar248;
  fVar296 = fVar275 - fVar249;
  fVar239 = fVar239 + fVar252;
  fVar247 = fVar247 + fVar270;
  fVar248 = fVar248 + fVar272;
  fVar249 = fVar249 + fVar275;
  fVar422 = 1.0 - fVar198;
  fVar357 = fVar334 * fVar422 + fVar250 * fVar198;
  fVar366 = fVar351 * fVar422 + fVar251 * fVar198;
  fVar369 = fVar414 * fVar422 + fVar330 * fVar198;
  fVar372 = fVar424 * fVar422 + fVar407 * fVar198;
  fVar387 = ((fVar413 - fVar386) * 0.33333334 + fVar334) * fVar422 +
            ((fVar436 - fVar318) * 0.33333334 + fVar250) * fVar198;
  fVar388 = ((fVar423 - fVar399) * 0.33333334 + fVar351) * fVar422 +
            ((fVar437 - fVar396) * 0.33333334 + fVar251) * fVar198;
  fVar405 = ((fVar428 - fVar404) * 0.33333334 + fVar414) * fVar422 +
            ((fVar274 - fVar333) * 0.33333334 + fVar330) * fVar198;
  fVar410 = ((fVar432 - fVar409) * 0.33333334 + fVar424) * fVar422 +
            ((fVar277 - fVar347) * 0.33333334 + fVar407) * fVar198;
  fVar252 = (fVar348 - (fVar458 - fVar253) * 0.33333334) * fVar422 +
            (fVar291 - (fVar161 - fVar412) * 0.33333334) * fVar198;
  fVar270 = (fVar354 - (fVar196 - fVar271) * 0.33333334) * fVar422 +
            (fVar383 - (fVar195 - fVar427) * 0.33333334) * fVar198;
  fVar272 = (fVar385 - (fVar199 - fVar273) * 0.33333334) * fVar422 +
            (fVar203 - (fVar237 - fVar429) * 0.33333334) * fVar198;
  fVar275 = (fVar398 - (fVar200 - fVar276) * 0.33333334) * fVar422 +
            (fVar296 - (fVar238 - fVar433) * 0.33333334) * fVar198;
  fVar382 = fVar348 * fVar422 + fVar291 * fVar198;
  fVar250 = fVar354 * fVar422 + fVar383 * fVar198;
  fVar251 = fVar385 * fVar422 + fVar203 * fVar198;
  fVar330 = fVar398 * fVar422 + fVar296 * fVar198;
  fVar291 = fVar415 * fVar422 + fVar350 * fVar198;
  fVar203 = fVar425 * fVar422 + fVar384 * fVar198;
  fVar314 = fVar430 * fVar422 + fVar397 * fVar198;
  fVar328 = fVar434 * fVar422 + fVar402 * fVar198;
  fVar334 = ((fVar386 + fVar413) * 0.33333334 + fVar415) * fVar422 +
            ((fVar318 + fVar436) * 0.33333334 + fVar350) * fVar198;
  fVar348 = ((fVar399 + fVar423) * 0.33333334 + fVar425) * fVar422 +
            ((fVar396 + fVar437) * 0.33333334 + fVar384) * fVar198;
  fVar351 = ((fVar404 + fVar428) * 0.33333334 + fVar430) * fVar422 +
            ((fVar333 + fVar274) * 0.33333334 + fVar397) * fVar198;
  fVar354 = ((fVar409 + fVar432) * 0.33333334 + fVar434) * fVar422 +
            ((fVar347 + fVar277) * 0.33333334 + fVar402) * fVar198;
  fVar383 = (fVar445 - (fVar253 + fVar458) * 0.33333334) * fVar422 +
            (fVar239 - (fVar412 + fVar161) * 0.33333334) * fVar198;
  fVar296 = (fVar447 - (fVar271 + fVar196) * 0.33333334) * fVar422 +
            (fVar247 - (fVar427 + fVar195) * 0.33333334) * fVar198;
  fVar318 = (fVar454 - (fVar273 + fVar199) * 0.33333334) * fVar422 +
            (fVar248 - (fVar429 + fVar237) * 0.33333334) * fVar198;
  fVar396 = (fVar456 - (fVar276 + fVar200) * 0.33333334) * fVar422 +
            (fVar249 - (fVar433 + fVar238) * 0.33333334) * fVar198;
  fVar414 = fVar422 * fVar445 + fVar198 * fVar239;
  fVar398 = fVar422 * fVar447 + fVar198 * fVar247;
  fVar403 = fVar422 * fVar454 + fVar198 * fVar248;
  fVar253 = fVar422 * fVar456 + fVar198 * fVar249;
  fVar161 = *(float *)(ray + k * 4);
  fVar195 = *(float *)(ray + k * 4 + 0x10);
  fVar198 = *(float *)(ray + k * 4 + 0x20);
  fVar333 = fVar357 - fVar161;
  fVar347 = fVar366 - fVar195;
  fVar350 = fVar369 - fVar198;
  fVar237 = pre->ray_space[k].vx.field_0.m128[0];
  fVar238 = pre->ray_space[k].vx.field_0.m128[1];
  fVar239 = pre->ray_space[k].vy.field_0.m128[0];
  fVar247 = pre->ray_space[k].vy.field_0.m128[1];
  fVar248 = pre->ray_space[k].vz.field_0.m128[0];
  fVar249 = pre->ray_space[k].vz.field_0.m128[1];
  fVar436 = fVar333 * fVar237 + fVar347 * fVar239 + fVar350 * fVar248;
  fVar271 = fVar333 * fVar238 + fVar347 * fVar247 + fVar350 * fVar249;
  auVar145._4_4_ = fVar271;
  auVar145._0_4_ = fVar436;
  fVar384 = fVar387 - fVar161;
  fVar407 = fVar388 - fVar195;
  fVar427 = fVar405 - fVar198;
  fVar447 = fVar384 * fVar237 + fVar407 * fVar239 + fVar427 * fVar248;
  fVar454 = fVar384 * fVar238 + fVar407 * fVar247 + fVar427 * fVar249;
  auVar377._4_4_ = fVar454;
  auVar377._0_4_ = fVar447;
  fVar397 = fVar252 - fVar161;
  fVar412 = fVar270 - fVar195;
  fVar445 = fVar272 - fVar198;
  fVar402 = fVar397 * fVar237 + fVar412 * fVar239 + fVar445 * fVar248;
  fVar422 = fVar397 * fVar238 + fVar412 * fVar247 + fVar445 * fVar249;
  auVar176._4_4_ = fVar422;
  auVar176._0_4_ = fVar402;
  fVar385 = fVar382 - fVar161;
  fVar429 = fVar250 - fVar195;
  fVar408 = fVar251 - fVar198;
  fVar424 = fVar385 * fVar237 + fVar429 * fVar239 + fVar408 * fVar248;
  fVar433 = fVar385 * fVar238 + fVar429 * fVar247 + fVar408 * fVar249;
  auVar439._4_4_ = fVar433;
  auVar439._0_4_ = fVar424;
  fVar456 = fVar291 - fVar161;
  fVar196 = fVar203 - fVar195;
  fVar200 = fVar314 - fVar198;
  fVar458 = fVar456 * fVar237 + fVar196 * fVar239 + fVar200 * fVar248;
  fVar199 = fVar456 * fVar238 + fVar196 * fVar247 + fVar200 * fVar249;
  fVar437 = fVar334 - fVar161;
  fVar274 = fVar348 - fVar195;
  fVar277 = fVar351 - fVar198;
  fVar273 = fVar437 * fVar237 + fVar274 * fVar239 + fVar277 * fVar248;
  fVar276 = fVar437 * fVar238 + fVar274 * fVar247 + fVar277 * fVar249;
  auVar377._12_4_ = fVar276;
  auVar377._8_4_ = fVar273;
  fVar386 = fVar383 - fVar161;
  fVar404 = fVar296 - fVar195;
  fVar413 = fVar318 - fVar198;
  fVar399 = fVar386 * fVar237 + fVar404 * fVar239 + fVar413 * fVar248;
  fVar409 = fVar386 * fVar238 + fVar404 * fVar247 + fVar413 * fVar249;
  fVar161 = fVar414 - fVar161;
  fVar195 = fVar398 - fVar195;
  fVar198 = fVar403 - fVar198;
  fVar239 = fVar161 * fVar237 + fVar195 * fVar239 + fVar198 * fVar248;
  fVar238 = fVar161 * fVar238 + fVar195 * fVar247 + fVar198 * fVar249;
  auVar439._12_4_ = fVar238;
  auVar439._8_4_ = fVar239;
  auVar145._8_4_ = fVar458;
  auVar145._12_4_ = fVar199;
  auVar120 = minps(auVar145,auVar377);
  auVar176._8_4_ = fVar399;
  auVar176._12_4_ = fVar409;
  auVar254 = minps(auVar176,auVar439);
  auVar120 = minps(auVar120,auVar254);
  auVar177._4_4_ = fVar271;
  auVar177._0_4_ = fVar436;
  auVar177._8_4_ = fVar458;
  auVar177._12_4_ = fVar199;
  auVar254 = maxps(auVar177,auVar377);
  auVar224._4_4_ = fVar422;
  auVar224._0_4_ = fVar402;
  auVar224._8_4_ = fVar399;
  auVar224._12_4_ = fVar409;
  auVar119 = maxps(auVar224,auVar439);
  auVar178 = maxps(auVar254,auVar119);
  auVar33._4_8_ = auVar119._8_8_;
  auVar33._0_4_ = auVar120._4_4_;
  auVar225._0_8_ = auVar33._0_8_ << 0x20;
  auVar225._8_4_ = auVar120._8_4_;
  auVar225._12_4_ = auVar120._12_4_;
  auVar226._8_8_ = auVar120._8_8_;
  auVar226._0_8_ = auVar225._8_8_;
  auVar254 = minps(auVar120,auVar226);
  auVar34._4_8_ = auVar120._8_8_;
  auVar34._0_4_ = auVar178._4_4_;
  auVar227._0_8_ = auVar34._0_8_ << 0x20;
  auVar227._8_4_ = auVar178._8_4_;
  auVar227._12_4_ = auVar178._12_4_;
  auVar228._8_8_ = auVar178._8_8_;
  auVar228._0_8_ = auVar227._8_8_;
  auVar120 = maxps(auVar178,auVar228);
  auVar146._0_8_ = auVar254._0_8_ & 0x7fffffff7fffffff;
  auVar146._8_4_ = auVar254._8_4_ & 0x7fffffff;
  auVar146._12_4_ = auVar254._12_4_ & 0x7fffffff;
  auVar179._0_8_ = auVar120._0_8_ & 0x7fffffff7fffffff;
  auVar179._8_4_ = auVar120._8_4_ & 0x7fffffff;
  auVar179._12_4_ = auVar120._12_4_ & 0x7fffffff;
  auVar120 = maxps(auVar146,auVar179);
  fVar237 = auVar120._4_4_;
  if (auVar120._4_4_ <= auVar120._0_4_) {
    fVar237 = auVar120._0_4_;
  }
  uVar103 = uVar108 + 0xf;
  fVar237 = fVar237 * 9.536743e-07;
  local_4f8 = CONCAT44(fVar199,fVar458);
  uVar109 = 0;
  fVar247 = *(float *)(ray + k * 4 + 0x30);
  local_538.lower = 0.0;
  local_538.upper = 1.0;
  local_548._0_4_ = 0.0;
  local_548._4_4_ = 1.0;
  fStack_540 = 0.0;
  fStack_53c = 0.0;
  local_380 = uVar103;
LAB_003d3041:
  do {
    fVar248 = 1.0 - (float)local_548._0_4_;
    fVar249 = 1.0 - (float)local_548._0_4_;
    fVar415 = 1.0 - (float)local_548._4_4_;
    fVar423 = 1.0 - (float)local_548._4_4_;
    fVar358 = fVar436 * fVar248 + fVar458 * (float)local_548._0_4_;
    fVar367 = fVar271 * fVar249 + fVar199 * (float)local_548._0_4_;
    fVar370 = fVar436 * fVar415 + fVar458 * (float)local_548._4_4_;
    fVar373 = fVar271 * fVar423 + fVar199 * (float)local_548._4_4_;
    fVar434 = fVar447 * fVar248 + fVar273 * (float)local_548._0_4_;
    fVar349 = fVar454 * fVar249 + fVar276 * (float)local_548._0_4_;
    fVar352 = fVar447 * fVar415 + fVar273 * (float)local_548._4_4_;
    fVar355 = fVar454 * fVar423 + fVar276 * (float)local_548._4_4_;
    fVar448 = fVar402 * fVar248 + fVar399 * (float)local_548._0_4_;
    fVar455 = fVar422 * fVar249 + fVar409 * (float)local_548._0_4_;
    fVar457 = fVar402 * fVar415 + fVar399 * (float)local_548._4_4_;
    fVar459 = fVar422 * fVar423 + fVar409 * (float)local_548._4_4_;
    fVar416 = fVar248 * fVar424 + (float)local_548._0_4_ * fVar239;
    fVar426 = fVar249 * fVar433 + (float)local_548._0_4_ * fVar238;
    fVar431 = fVar415 * fVar424 + (float)local_548._4_4_ * fVar239;
    fVar435 = fVar423 * fVar433 + (float)local_548._4_4_ * fVar238;
    fVar375 = (local_538.upper - local_538.lower) * 0.11111111;
    fVar438 = (local_538.upper - local_538.lower) * 0.0 + local_538.lower;
    fVar443 = (local_538.upper - local_538.lower) * 0.33333334 + local_538.lower;
    fVar444 = (local_538.upper - local_538.lower) * 0.6666667 + local_538.lower;
    fVar446 = (local_538.upper - local_538.lower) * 1.0 + local_538.lower;
    fVar415 = 1.0 - fVar438;
    fVar423 = 1.0 - fVar443;
    fVar430 = 1.0 - fVar444;
    fVar432 = 1.0 - fVar446;
    fVar428 = fVar434 * fVar415 + fVar448 * fVar438;
    fVar290 = fVar434 * fVar423 + fVar448 * fVar443;
    fVar292 = fVar434 * fVar430 + fVar448 * fVar444;
    fVar293 = fVar434 * fVar432 + fVar448 * fVar446;
    fVar294 = fVar349 * fVar415 + fVar455 * fVar438;
    fVar297 = fVar349 * fVar423 + fVar455 * fVar443;
    fVar298 = fVar349 * fVar430 + fVar455 * fVar444;
    fVar299 = fVar349 * fVar432 + fVar455 * fVar446;
    fVar248 = (fVar358 * fVar415 + fVar434 * fVar438) * fVar415 + fVar438 * fVar428;
    fVar249 = (fVar358 * fVar423 + fVar434 * fVar443) * fVar423 + fVar443 * fVar290;
    fVar425 = (fVar358 * fVar430 + fVar434 * fVar444) * fVar430 + fVar444 * fVar292;
    fVar434 = (fVar358 * fVar432 + fVar434 * fVar446) * fVar432 + fVar446 * fVar293;
    fVar358 = (fVar367 * fVar415 + fVar349 * fVar438) * fVar415 + fVar438 * fVar294;
    fVar315 = (fVar367 * fVar423 + fVar349 * fVar443) * fVar423 + fVar443 * fVar297;
    fVar316 = (fVar367 * fVar430 + fVar349 * fVar444) * fVar430 + fVar444 * fVar298;
    fVar317 = (fVar367 * fVar432 + fVar349 * fVar446) * fVar432 + fVar446 * fVar299;
    fVar349 = fVar428 * fVar415 + (fVar448 * fVar415 + fVar416 * fVar438) * fVar438;
    fVar428 = fVar290 * fVar423 + (fVar448 * fVar423 + fVar416 * fVar443) * fVar443;
    fVar290 = fVar292 * fVar430 + (fVar448 * fVar430 + fVar416 * fVar444) * fVar444;
    fVar292 = fVar293 * fVar432 + (fVar448 * fVar432 + fVar416 * fVar446) * fVar446;
    fVar293 = fVar294 * fVar415 + (fVar455 * fVar415 + fVar426 * fVar438) * fVar438;
    fVar294 = fVar297 * fVar423 + (fVar455 * fVar423 + fVar426 * fVar443) * fVar443;
    fVar297 = fVar298 * fVar430 + (fVar455 * fVar430 + fVar426 * fVar444) * fVar444;
    fVar298 = fVar299 * fVar432 + (fVar455 * fVar432 + fVar426 * fVar446) * fVar446;
    fVar367 = fVar415 * fVar248 + fVar438 * fVar349;
    fVar416 = fVar423 * fVar249 + fVar443 * fVar428;
    fVar426 = fVar430 * fVar425 + fVar444 * fVar290;
    fVar448 = fVar432 * fVar434 + fVar446 * fVar292;
    fVar389 = fVar415 * fVar358 + fVar438 * fVar293;
    fVar400 = fVar423 * fVar315 + fVar443 * fVar294;
    fVar406 = fVar430 * fVar316 + fVar444 * fVar297;
    fVar411 = fVar432 * fVar317 + fVar446 * fVar298;
    fVar249 = (fVar428 - fVar249) * 3.0 * fVar375;
    fVar428 = (fVar290 - fVar425) * 3.0 * fVar375;
    fVar290 = (fVar292 - fVar434) * 3.0 * fVar375;
    fVar292 = (fVar294 - fVar315) * 3.0 * fVar375;
    fVar294 = (fVar297 - fVar316) * 3.0 * fVar375;
    fVar297 = (fVar298 - fVar317) * 3.0 * fVar375;
    fVar319 = fVar367 + (fVar349 - fVar248) * 3.0 * fVar375;
    fVar329 = fVar416 + fVar249;
    fVar331 = fVar426 + fVar428;
    fVar332 = fVar448 + fVar290;
    fVar248 = fVar389 + (fVar293 - fVar358) * 3.0 * fVar375;
    fVar425 = fVar400 + fVar292;
    fVar434 = fVar406 + fVar294;
    fVar293 = fVar411 + fVar297;
    fVar249 = fVar416 - fVar249;
    fVar428 = fVar426 - fVar428;
    fVar290 = fVar448 - fVar290;
    auVar147._0_4_ = fVar400 - fVar292;
    auVar147._4_4_ = fVar406 - fVar294;
    auVar147._8_4_ = fVar411 - fVar297;
    auVar147._12_4_ = 0;
    fVar297 = fVar352 * fVar415 + fVar457 * fVar438;
    fVar298 = fVar352 * fVar423 + fVar457 * fVar443;
    fVar299 = fVar352 * fVar430 + fVar457 * fVar444;
    fVar358 = fVar352 * fVar432 + fVar457 * fVar446;
    fVar315 = fVar355 * fVar415 + fVar459 * fVar438;
    fVar316 = fVar355 * fVar423 + fVar459 * fVar443;
    fVar317 = fVar355 * fVar430 + fVar459 * fVar444;
    fVar356 = fVar355 * fVar432 + fVar459 * fVar446;
    fVar292 = (fVar370 * fVar415 + fVar352 * fVar438) * fVar415 + fVar438 * fVar297;
    fVar349 = (fVar370 * fVar423 + fVar352 * fVar443) * fVar423 + fVar443 * fVar298;
    fVar294 = (fVar370 * fVar430 + fVar352 * fVar444) * fVar430 + fVar444 * fVar299;
    fVar370 = (fVar370 * fVar432 + fVar352 * fVar446) * fVar432 + fVar446 * fVar358;
    fVar359 = (fVar373 * fVar415 + fVar355 * fVar438) * fVar415 + fVar438 * fVar315;
    fVar368 = (fVar373 * fVar423 + fVar355 * fVar443) * fVar423 + fVar443 * fVar316;
    fVar371 = (fVar373 * fVar430 + fVar355 * fVar444) * fVar430 + fVar444 * fVar317;
    fVar374 = (fVar373 * fVar432 + fVar355 * fVar446) * fVar432 + fVar446 * fVar356;
    fVar355 = fVar297 * fVar415 + (fVar457 * fVar415 + fVar431 * fVar438) * fVar438;
    fVar373 = fVar298 * fVar423 + (fVar457 * fVar423 + fVar431 * fVar443) * fVar443;
    fVar455 = fVar299 * fVar430 + (fVar457 * fVar430 + fVar431 * fVar444) * fVar444;
    fVar431 = fVar358 * fVar432 + (fVar457 * fVar432 + fVar431 * fVar446) * fVar446;
    fVar335 = fVar315 * fVar415 + (fVar459 * fVar415 + fVar435 * fVar438) * fVar438;
    fVar457 = fVar316 * fVar423 + (fVar459 * fVar423 + fVar435 * fVar443) * fVar443;
    fVar353 = fVar317 * fVar430 + (fVar459 * fVar430 + fVar435 * fVar444) * fVar444;
    fVar356 = fVar356 * fVar432 + (fVar459 * fVar432 + fVar435 * fVar446) * fVar446;
    fVar315 = fVar415 * fVar292 + fVar438 * fVar355;
    fVar316 = fVar423 * fVar349 + fVar443 * fVar373;
    fVar317 = fVar430 * fVar294 + fVar444 * fVar455;
    fVar352 = fVar432 * fVar370 + fVar446 * fVar431;
    fVar297 = fVar415 * fVar359 + fVar438 * fVar335;
    fVar298 = fVar423 * fVar368 + fVar443 * fVar457;
    fVar299 = fVar430 * fVar371 + fVar444 * fVar353;
    fVar358 = fVar432 * fVar374 + fVar446 * fVar356;
    fVar415 = (fVar373 - fVar349) * 3.0 * fVar375;
    fVar430 = (fVar455 - fVar294) * 3.0 * fVar375;
    fVar349 = (fVar431 - fVar370) * 3.0 * fVar375;
    fVar431 = (fVar457 - fVar368) * 3.0 * fVar375;
    fVar457 = (fVar353 - fVar371) * 3.0 * fVar375;
    fVar353 = (fVar356 - fVar374) * 3.0 * fVar375;
    fVar371 = fVar315 + (fVar355 - fVar292) * 3.0 * fVar375;
    fVar374 = fVar316 + fVar415;
    fVar435 = fVar317 + fVar430;
    fVar438 = fVar352 + fVar349;
    fVar335 = fVar297 + (fVar335 - fVar359) * 3.0 * fVar375;
    fVar356 = fVar298 + fVar431;
    fVar359 = fVar299 + fVar457;
    fVar368 = fVar358 + fVar353;
    fVar415 = fVar316 - fVar415;
    fVar430 = fVar317 - fVar430;
    fVar349 = fVar352 - fVar349;
    fVar431 = fVar298 - fVar431;
    fVar457 = fVar299 - fVar457;
    fVar353 = fVar358 - fVar353;
    fVar423 = (fVar316 - fVar416) + (fVar315 - fVar367);
    fVar432 = (fVar317 - fVar426) + (fVar316 - fVar416);
    fVar292 = (fVar352 - fVar448) + (fVar317 - fVar426);
    fVar294 = (fVar352 - fVar448) + 0.0;
    fVar370 = (fVar298 - fVar400) + (fVar297 - fVar389);
    fVar355 = (fVar299 - fVar406) + (fVar298 - fVar400);
    fVar373 = (fVar358 - fVar411) + (fVar299 - fVar406);
    fVar455 = (fVar358 - fVar411) + 0.0;
    auVar307._0_8_ =
         CONCAT44(fVar400 * fVar432 - fVar416 * fVar355,fVar389 * fVar423 - fVar367 * fVar370);
    auVar307._8_4_ = fVar406 * fVar292 - fVar426 * fVar373;
    auVar307._12_4_ = fVar411 * fVar294 - fVar448 * fVar455;
    auVar260._0_4_ = fVar248 * fVar423 - fVar319 * fVar370;
    auVar260._4_4_ = fVar425 * fVar432 - fVar329 * fVar355;
    auVar260._8_4_ = fVar434 * fVar292 - fVar331 * fVar373;
    auVar260._12_4_ = fVar293 * fVar294 - fVar332 * fVar455;
    auVar279._0_8_ =
         CONCAT44(auVar147._4_4_ * fVar432 - fVar355 * fVar428,
                  auVar147._0_4_ * fVar423 - fVar370 * fVar249);
    auVar279._8_4_ = auVar147._8_4_ * fVar292 - fVar373 * fVar290;
    auVar279._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
    auVar393._0_4_ = fVar423 * fVar400 - fVar370 * fVar416;
    auVar393._4_4_ = fVar432 * fVar406 - fVar355 * fVar426;
    auVar393._8_4_ = fVar292 * fVar411 - fVar373 * fVar448;
    auVar393._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
    auVar340._0_8_ =
         CONCAT44(fVar298 * fVar432 - fVar316 * fVar355,fVar297 * fVar423 - fVar315 * fVar370);
    auVar340._8_4_ = fVar299 * fVar292 - fVar317 * fVar373;
    auVar340._12_4_ = fVar358 * fVar294 - fVar352 * fVar455;
    auVar420._0_4_ = fVar335 * fVar423 - fVar371 * fVar370;
    auVar420._4_4_ = fVar356 * fVar432 - fVar374 * fVar355;
    auVar420._8_4_ = fVar359 * fVar292 - fVar435 * fVar373;
    auVar420._12_4_ = fVar368 * fVar294 - fVar438 * fVar455;
    auVar320._0_8_ =
         CONCAT44(fVar457 * fVar432 - fVar355 * fVar430,fVar431 * fVar423 - fVar370 * fVar415);
    auVar320._8_4_ = fVar353 * fVar292 - fVar373 * fVar349;
    auVar320._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
    auVar156._0_4_ = fVar423 * fVar298 - fVar370 * fVar316;
    auVar156._4_4_ = fVar432 * fVar299 - fVar355 * fVar317;
    auVar156._8_4_ = fVar292 * fVar358 - fVar373 * fVar352;
    auVar156._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
    auVar180._8_4_ = auVar307._8_4_;
    auVar180._0_8_ = auVar307._0_8_;
    auVar180._12_4_ = auVar307._12_4_;
    auVar120 = minps(auVar180,auVar260);
    auVar178 = maxps(auVar307,auVar260);
    auVar261._8_4_ = auVar279._8_4_;
    auVar261._0_8_ = auVar279._0_8_;
    auVar261._12_4_ = auVar279._12_4_;
    auVar254 = minps(auVar261,auVar393);
    auVar120 = minps(auVar120,auVar254);
    auVar254 = maxps(auVar279,auVar393);
    auVar119 = maxps(auVar178,auVar254);
    auVar262._8_4_ = auVar340._8_4_;
    auVar262._0_8_ = auVar340._0_8_;
    auVar262._12_4_ = auVar340._12_4_;
    auVar254 = minps(auVar262,auVar420);
    auVar341 = maxps(auVar340,auVar420);
    auVar280._8_4_ = auVar320._8_4_;
    auVar280._0_8_ = auVar320._0_8_;
    auVar280._12_4_ = auVar320._12_4_;
    auVar178 = minps(auVar280,auVar156);
    auVar254 = minps(auVar254,auVar178);
    auVar120 = minps(auVar120,auVar254);
    auVar254 = maxps(auVar320,auVar156);
    auVar254 = maxps(auVar341,auVar254);
    auVar254 = maxps(auVar119,auVar254);
    bVar110 = auVar120._4_4_ <= fVar237;
    bVar28 = auVar120._8_4_ <= fVar237;
    auVar89._4_4_ = -(uint)bVar28;
    auVar89._0_4_ = -(uint)bVar110;
    auVar89._8_4_ = -(uint)(auVar120._12_4_ <= fVar237);
    auVar89._12_4_ = 0;
    auVar184 = auVar89 << 0x20;
    bVar93 = (-fVar237 <= auVar254._0_4_ && auVar120._0_4_ <= fVar237) && bVar30;
    auVar308._0_4_ = -(uint)bVar93;
    bVar94 = (-fVar237 <= auVar254._4_4_ && bVar110) && bVar31;
    auVar308._4_4_ = -(uint)bVar94;
    bVar110 = (-fVar237 <= auVar254._8_4_ && bVar28) && bVar32;
    auVar308._8_4_ = -(uint)bVar110;
    auVar308._12_4_ = 0;
    uVar113 = movmskps((int)uVar103,auVar308);
    uVar103 = (ulong)uVar113;
    if (uVar113 != 0) {
      fVar423 = (fVar316 - fVar315) + (fVar416 - fVar367);
      fVar432 = (fVar317 - fVar316) + (fVar426 - fVar416);
      fVar292 = (fVar352 - fVar317) + (fVar448 - fVar426);
      fVar294 = (0.0 - fVar352) + (0.0 - fVar448);
      fVar370 = (fVar298 - fVar297) + (fVar400 - fVar389);
      fVar355 = (fVar299 - fVar298) + (fVar406 - fVar400);
      fVar373 = (fVar358 - fVar299) + (fVar411 - fVar406);
      fVar455 = (0.0 - fVar358) + (0.0 - fVar411);
      auVar440._0_8_ =
           CONCAT44(fVar400 * fVar432 - fVar416 * fVar355,fVar389 * fVar423 - fVar367 * fVar370);
      auVar440._8_4_ = fVar406 * fVar292 - fVar426 * fVar373;
      auVar440._12_4_ = fVar411 * fVar294 - fVar448 * fVar455;
      auVar263._0_4_ = fVar248 * fVar423 - fVar319 * fVar370;
      auVar263._4_4_ = fVar425 * fVar432 - fVar329 * fVar355;
      auVar263._8_4_ = fVar434 * fVar292 - fVar331 * fVar373;
      auVar263._12_4_ = fVar293 * fVar294 - fVar332 * fVar455;
      auVar321._0_8_ =
           CONCAT44(auVar147._4_4_ * fVar432 - fVar428 * fVar355,
                    auVar147._0_4_ * fVar423 - fVar249 * fVar370);
      auVar321._8_4_ = auVar147._8_4_ * fVar292 - fVar290 * fVar373;
      auVar321._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
      auVar281._0_4_ = fVar400 * fVar423 - fVar416 * fVar370;
      auVar281._4_4_ = fVar406 * fVar432 - fVar426 * fVar355;
      auVar281._8_4_ = fVar411 * fVar292 - fVar448 * fVar373;
      auVar281._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
      auVar229._0_8_ =
           CONCAT44(fVar298 * fVar432 - fVar316 * fVar355,fVar297 * fVar423 - fVar315 * fVar370);
      auVar229._8_4_ = fVar299 * fVar292 - fVar317 * fVar373;
      auVar229._12_4_ = fVar358 * fVar294 - fVar352 * fVar455;
      auVar361._0_4_ = fVar335 * fVar423 - fVar371 * fVar370;
      auVar361._4_4_ = fVar356 * fVar432 - fVar374 * fVar355;
      auVar361._8_4_ = fVar359 * fVar292 - fVar435 * fVar373;
      auVar361._12_4_ = fVar368 * fVar294 - fVar438 * fVar455;
      auVar394._0_8_ =
           CONCAT44(fVar457 * fVar432 - fVar430 * fVar355,fVar431 * fVar423 - fVar415 * fVar370);
      auVar394._8_4_ = fVar353 * fVar292 - fVar349 * fVar373;
      auVar394._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
      auVar156._0_4_ = fVar423 * fVar298 - fVar370 * fVar316;
      auVar156._4_4_ = fVar432 * fVar299 - fVar355 * fVar317;
      auVar156._8_4_ = fVar292 * fVar358 - fVar373 * fVar352;
      auVar156._12_4_ = fVar294 * 0.0 - fVar455 * 0.0;
      auVar181._8_4_ = auVar440._8_4_;
      auVar181._0_8_ = auVar440._0_8_;
      auVar181._12_4_ = auVar440._12_4_;
      auVar120 = minps(auVar181,auVar263);
      auVar178 = maxps(auVar440,auVar263);
      auVar264._8_4_ = auVar321._8_4_;
      auVar264._0_8_ = auVar321._0_8_;
      auVar264._12_4_ = auVar321._12_4_;
      auVar254 = minps(auVar264,auVar281);
      auVar120 = minps(auVar120,auVar254);
      auVar254 = maxps(auVar321,auVar281);
      auVar341 = maxps(auVar178,auVar254);
      auVar265._8_4_ = auVar229._8_4_;
      auVar265._0_8_ = auVar229._0_8_;
      auVar265._12_4_ = auVar229._12_4_;
      auVar178 = minps(auVar265,auVar361);
      auVar254 = maxps(auVar229,auVar361);
      auVar282._8_4_ = auVar394._8_4_;
      auVar282._0_8_ = auVar394._0_8_;
      auVar282._12_4_ = auVar394._12_4_;
      auVar119 = minps(auVar282,auVar156);
      auVar178 = minps(auVar178,auVar119);
      auVar120 = minps(auVar120,auVar178);
      auVar178 = maxps(auVar394,auVar156);
      auVar254 = maxps(auVar254,auVar178);
      auVar254 = maxps(auVar341,auVar254);
      bVar28 = auVar120._4_4_ <= fVar237;
      bVar29 = auVar120._8_4_ <= fVar237;
      auVar90._4_4_ = -(uint)bVar29;
      auVar90._0_4_ = -(uint)bVar28;
      auVar90._8_4_ = -(uint)(auVar120._12_4_ <= fVar237);
      auVar90._12_4_ = 0;
      auVar184 = auVar90 << 0x20;
      auVar441._0_4_ = -(uint)((-fVar237 <= auVar254._0_4_ && auVar120._0_4_ <= fVar237) && bVar93);
      auVar441._4_4_ = -(uint)((-fVar237 <= auVar254._4_4_ && bVar28) && bVar94);
      auVar441._8_4_ = -(uint)((-fVar237 <= auVar254._8_4_ && bVar29) && bVar110);
      auVar441._12_4_ = 0;
      uVar113 = movmskps(uVar113,auVar441);
      uVar103 = (ulong)uVar113;
      if (uVar113 != 0) {
        uVar103 = (ulong)(byte)uVar113;
        mask_stack[uVar109] = uVar113 & 0xff;
        cu_stack[uVar109] = local_538;
        cv_stack[uVar109].lower = (float)local_548._0_4_;
        cv_stack[uVar109].upper = (float)local_548._4_4_;
        uVar109 = (ulong)((int)uVar109 + 1);
        auVar156 = _local_548;
      }
    }
LAB_003d36c5:
    _local_528 = auVar147;
    auVar120 = _local_528;
    if ((int)uVar109 == 0) {
      fVar161 = *(float *)(ray + k * 4 + 0x80);
      auVar193._4_4_ = -(uint)(fVar116 <= fVar161);
      auVar193._0_4_ = -(uint)(fVar401 <= fVar161);
      auVar193._8_4_ = -(uint)(fVar159 <= fVar161);
      auVar193._12_4_ = -(uint)(fVar160 <= fVar161);
      uVar111 = movmskps((int)uVar103,auVar193);
      uVar111 = (uint)uVar108 & (uint)local_380 & uVar111;
      goto LAB_003d21f1;
    }
    uVar114 = (int)uVar109 - 1;
    uVar103 = (ulong)uVar114;
    uVar113 = mask_stack[uVar103];
    local_548._0_4_ = cv_stack[uVar103].lower;
    local_548._4_4_ = cv_stack[uVar103].upper;
    fStack_540 = 0.0;
    fStack_53c = 0.0;
    uVar11 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar113 = uVar113 - 1 & uVar113;
    mask_stack[uVar103] = uVar113;
    if (uVar113 == 0) {
      uVar109 = (ulong)uVar114;
    }
    fVar415 = (float)(uVar11 + 1) * 0.33333334;
    fVar423 = auVar156._4_4_ * 0.0;
    fVar425 = auVar184._4_4_ * 0.0;
    fVar248 = cu_stack[uVar103].lower;
    fVar249 = cu_stack[uVar103].upper;
    local_538.lower =
         fVar248 * (1.0 - (float)uVar11 * 0.33333334) + fVar249 * (float)uVar11 * 0.33333334;
    local_538.upper = fVar248 * (1.0 - fVar415) + fVar249 * fVar415;
    fVar415 = fVar248 * (0.0 - fVar423) + fVar249 * fVar423;
    fVar249 = fVar248 * (0.0 - fVar425) + fVar249 * fVar425;
    fVar248 = local_538.upper - local_538.lower;
    if (fVar248 < 0.16666667) {
      fVar434 = 1.0 - (float)local_548._0_4_;
      fVar349 = 1.0 - (float)local_548._0_4_;
      fVar294 = 1.0 - (float)local_548._4_4_;
      fVar297 = 1.0 - (float)local_548._4_4_;
      fVar432 = fVar436 * fVar434 + fVar458 * (float)local_548._0_4_;
      fVar290 = fVar271 * fVar349 + fVar199 * (float)local_548._0_4_;
      fVar292 = fVar436 * fVar294 + fVar458 * (float)local_548._4_4_;
      fVar293 = fVar271 * fVar297 + fVar199 * (float)local_548._4_4_;
      fVar423 = fVar447 * fVar434 + fVar273 * (float)local_548._0_4_;
      fVar425 = fVar454 * fVar349 + fVar276 * (float)local_548._0_4_;
      fVar428 = fVar447 * fVar294 + fVar273 * (float)local_548._4_4_;
      fVar430 = fVar454 * fVar297 + fVar276 * (float)local_548._4_4_;
      fVar317 = fVar402 * fVar434 + fVar399 * (float)local_548._0_4_;
      fVar352 = fVar422 * fVar349 + fVar409 * (float)local_548._0_4_;
      fVar355 = fVar402 * fVar294 + fVar399 * (float)local_548._4_4_;
      fVar455 = fVar422 * fVar297 + fVar409 * (float)local_548._4_4_;
      fVar315 = (fVar434 * fVar424 + (float)local_548._0_4_ * fVar239) - fVar317;
      fVar416 = (fVar349 * fVar433 + (float)local_548._0_4_ * fVar238) - fVar352;
      fVar316 = (fVar294 * fVar424 + (float)local_548._4_4_ * fVar239) - fVar355;
      fVar426 = (fVar297 * fVar433 + (float)local_548._4_4_ * fVar238) - fVar455;
      fVar434 = local_538.lower * (fVar317 - fVar423) + fVar423;
      fVar349 = local_538.lower * (fVar352 - fVar425) + fVar425;
      fVar294 = local_538.lower * (fVar355 - fVar428) + fVar428;
      fVar297 = local_538.lower * (fVar455 - fVar430) + fVar430;
      fVar448 = (fVar317 - fVar423) * local_538.upper + fVar423;
      fVar370 = (fVar352 - fVar425) * local_538.upper + fVar425;
      fVar373 = (fVar355 - fVar428) * local_538.upper + fVar428;
      fVar431 = (fVar455 - fVar430) * local_538.upper + fVar430;
      fVar298 = local_538.lower * (fVar423 - fVar432) + fVar432;
      fVar299 = local_538.lower * (fVar425 - fVar290) + fVar290;
      fVar358 = local_538.lower * (fVar428 - fVar292) + fVar292;
      fVar367 = local_538.lower * (fVar430 - fVar293) + fVar293;
      fVar298 = (fVar434 - fVar298) * local_538.lower + fVar298;
      fVar299 = (fVar349 - fVar299) * local_538.lower + fVar299;
      fVar358 = (fVar294 - fVar358) * local_538.lower + fVar358;
      fVar367 = (fVar297 - fVar367) * local_538.lower + fVar367;
      fVar434 = (((local_538.lower * fVar315 + fVar317) - fVar434) * local_538.lower + fVar434) -
                fVar298;
      fVar349 = (((local_538.lower * fVar416 + fVar352) - fVar349) * local_538.lower + fVar349) -
                fVar299;
      fVar294 = (((local_538.lower * fVar316 + fVar355) - fVar294) * local_538.lower + fVar294) -
                fVar358;
      fVar297 = (((local_538.lower * fVar426 + fVar455) - fVar297) * local_538.lower + fVar297) -
                fVar367;
      fVar298 = local_538.lower * fVar434 + fVar298;
      fVar299 = local_538.lower * fVar349 + fVar299;
      fVar358 = local_538.lower * fVar294 + fVar358;
      fVar367 = local_538.lower * fVar297 + fVar367;
      fVar432 = (fVar423 - fVar432) * local_538.upper + fVar432;
      fVar290 = (fVar425 - fVar290) * local_538.upper + fVar290;
      fVar292 = (fVar428 - fVar292) * local_538.upper + fVar292;
      fVar293 = (fVar430 - fVar293) * local_538.upper + fVar293;
      fVar432 = (fVar448 - fVar432) * local_538.upper + fVar432;
      fVar290 = (fVar370 - fVar290) * local_538.upper + fVar290;
      fVar292 = (fVar373 - fVar292) * local_538.upper + fVar292;
      fVar293 = (fVar431 - fVar293) * local_538.upper + fVar293;
      fVar425 = (((fVar315 * local_538.upper + fVar317) - fVar448) * local_538.upper + fVar448) -
                fVar432;
      fVar428 = (((fVar416 * local_538.upper + fVar352) - fVar370) * local_538.upper + fVar370) -
                fVar290;
      fVar430 = (((fVar316 * local_538.upper + fVar355) - fVar373) * local_538.upper + fVar373) -
                fVar292;
      fVar370 = (((fVar426 * local_538.upper + fVar455) - fVar431) * local_538.upper + fVar431) -
                fVar293;
      fVar432 = local_538.upper * fVar425 + fVar432;
      fVar290 = local_538.upper * fVar428 + fVar290;
      fVar292 = local_538.upper * fVar430 + fVar292;
      fVar293 = local_538.upper * fVar370 + fVar293;
      fVar423 = fVar248 * 0.33333334;
      fVar315 = fVar434 * (float)DAT_01f4afa0 * fVar423 + fVar298;
      fVar416 = fVar349 * DAT_01f4afa0._4_4_ * fVar423 + fVar299;
      fVar316 = fVar294 * DAT_01f4afa0._8_4_ * fVar423 + fVar358;
      fVar426 = fVar297 * DAT_01f4afa0._12_4_ * fVar423 + fVar367;
      fVar317 = fVar432 - fVar423 * fVar425 * (float)DAT_01f4afa0;
      fVar448 = fVar290 - fVar423 * fVar428 * DAT_01f4afa0._4_4_;
      fVar352 = fVar292 - fVar423 * fVar430 * DAT_01f4afa0._8_4_;
      fVar370 = fVar293 - fVar423 * fVar370 * DAT_01f4afa0._12_4_;
      auVar35._4_8_ = DAT_01f4afa0._8_8_;
      auVar35._0_4_ = fVar290;
      auVar322._0_8_ = auVar35._0_8_ << 0x20;
      auVar322._8_4_ = fVar292;
      auVar322._12_4_ = fVar293;
      fVar434 = (fVar292 - fVar432) + (fVar358 - fVar298);
      fVar349 = (fVar293 - fVar290) + (fVar367 - fVar299);
      auVar342._0_4_ = fVar448 * fVar349;
      auVar342._4_4_ = fVar448 * fVar349;
      auVar342._8_4_ = fVar370 * fVar349;
      auVar342._12_4_ = fVar370 * fVar349;
      fVar423 = fVar298 * fVar434 + fVar299 * fVar349;
      fVar425 = fVar358 * fVar434 + fVar367 * fVar349;
      fVar294 = fVar315 * fVar434 + fVar416 * fVar349;
      fVar297 = fVar316 * fVar434 + fVar426 * fVar349;
      fVar355 = fVar317 * fVar434 + auVar342._0_4_;
      auVar309._0_8_ = CONCAT44(fVar448 * fVar434 + auVar342._4_4_,fVar355);
      auVar309._8_4_ = fVar352 * fVar434 + auVar342._8_4_;
      auVar309._12_4_ = fVar370 * fVar434 + auVar342._12_4_;
      fVar430 = fVar434 * fVar432 + fVar349 * fVar290;
      fVar373 = fVar434 * fVar292 + fVar349 * fVar293;
      auVar36._4_8_ = auVar342._8_8_;
      auVar36._0_4_ = fVar416 * fVar434 + fVar416 * fVar349;
      auVar343._0_8_ = auVar36._0_8_ << 0x20;
      auVar343._8_4_ = fVar297;
      auVar343._12_4_ = fVar426 * fVar434 + fVar426 * fVar349;
      fVar428 = fVar294;
      if (fVar294 <= fVar423) {
        fVar428 = fVar423;
        fVar423 = fVar294;
      }
      auVar344._8_8_ = auVar343._8_8_;
      auVar344._0_8_ = auVar344._8_8_;
      auVar148._8_4_ = auVar309._8_4_;
      auVar148._0_8_ = auVar309._0_8_;
      auVar148._12_4_ = auVar309._12_4_;
      if (fVar430 <= fVar355) {
        auVar148._0_4_ = fVar430;
      }
      if (auVar148._0_4_ <= fVar423) {
        fVar423 = auVar148._0_4_;
      }
      auVar37._4_8_ = auVar148._8_8_;
      auVar37._0_4_ = fVar434 * fVar290 + fVar349 * fVar290;
      auVar149._0_8_ = auVar37._0_8_ << 0x20;
      auVar149._8_4_ = fVar373;
      auVar149._12_4_ = fVar434 * fVar293 + fVar349 * fVar293;
      if (fVar430 <= fVar355) {
        fVar430 = fVar355;
      }
      auVar156._8_8_ = auVar149._8_8_;
      auVar156._0_8_ = auVar156._8_8_;
      if (fVar430 <= fVar428) {
        fVar430 = fVar428;
      }
      if (fVar297 <= fVar425) {
        auVar344._0_4_ = fVar425;
        fVar425 = fVar297;
      }
      auVar182._8_4_ = auVar309._8_4_;
      auVar182._0_8_ = auVar309._8_8_;
      auVar182._12_4_ = auVar309._12_4_;
      if (fVar373 <= auVar309._8_4_) {
        auVar182._0_4_ = fVar373;
      }
      if (auVar182._0_4_ <= fVar425) {
        fVar425 = auVar182._0_4_;
      }
      if (fVar373 <= auVar309._8_4_) {
        auVar156._0_4_ = auVar309._8_4_;
      }
      if (auVar156._0_4_ <= auVar344._0_4_) {
        auVar156._0_4_ = auVar344._0_4_;
      }
      bVar110 = 3 < (uint)uVar109;
      uVar38 = (undefined3)(uVar114 >> 8);
      uVar103 = (ulong)CONCAT31(uVar38,bVar110);
      fVar428 = auVar156._0_4_;
      if ((0.0001 <= fVar423) || (fVar428 <= -0.0001)) break;
      goto LAB_003d3a2d;
    }
  } while( true );
  auVar184._0_12_ = ZEXT812(0x38d1b717);
  auVar184._12_4_ = 0;
  if ((fVar425 < 0.0001 && -0.0001 < fVar430) ||
     ((fVar423 < 0.0001 && -0.0001 < fVar430 ||
      (auVar147 = _local_528, fVar425 < 0.0001 && -0.0001 < fVar428)))) {
LAB_003d3a2d:
    local_528 = (undefined1  [8])auVar322._8_8_;
    auVar147 = _local_528;
    bVar110 = bVar110 || fVar248 < 0.001;
    uVar103 = (ulong)CONCAT31(uVar38,bVar110);
    fVar349 = (float)(~-(uint)(fVar423 < 0.0) & 0x3f800000 | -(uint)(fVar423 < 0.0) & 0xbf800000);
    fVar294 = (float)(~-(uint)(fVar430 < 0.0) & 0x3f800000 | -(uint)(fVar430 < 0.0) & 0xbf800000);
    fVar434 = 0.0;
    if ((fVar349 == fVar294) && (!NAN(fVar349) && !NAN(fVar294))) {
      fVar434 = INFINITY;
    }
    fVar297 = 0.0;
    if ((fVar349 == fVar294) && (!NAN(fVar349) && !NAN(fVar294))) {
      fVar297 = -INFINITY;
    }
    fVar355 = (float)(~-(uint)(fVar425 < 0.0) & 0x3f800000 | -(uint)(fVar425 < 0.0) & 0xbf800000);
    if ((fVar349 != fVar355) || (fVar373 = fVar297, NAN(fVar349) || NAN(fVar355))) {
      if ((fVar425 != fVar423) || (NAN(fVar425) || NAN(fVar423))) {
        fVar425 = -fVar423 / (fVar425 - fVar423);
        fVar425 = (1.0 - fVar425) * 0.0 + fVar425;
        fVar373 = fVar425;
      }
      else {
        fVar425 = 0.0;
        if ((fVar423 != 0.0) || (fVar373 = 1.0, NAN(fVar423))) {
          fVar425 = INFINITY;
          fVar373 = -INFINITY;
        }
      }
      if (fVar425 <= fVar434) {
        fVar434 = fVar425;
      }
      if (fVar373 <= fVar297) {
        fVar373 = fVar297;
      }
    }
    fVar423 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar428 < 0.0) * 4);
    if ((fVar294 != fVar423) || (fVar425 = fVar373, NAN(fVar294) || NAN(fVar423))) {
      if ((fVar428 != fVar430) || (NAN(fVar428) || NAN(fVar430))) {
        fVar349 = -fVar430 / (fVar428 - fVar430);
        fVar349 = (1.0 - fVar349) * 0.0 + fVar349;
        fVar425 = fVar349;
      }
      else {
        fVar349 = 0.0;
        if ((fVar430 != 0.0) || (fVar425 = 1.0, NAN(fVar430))) {
          fVar349 = INFINITY;
          fVar425 = -INFINITY;
        }
      }
      if (fVar349 <= fVar434) {
        fVar434 = fVar349;
      }
      if (fVar425 <= fVar373) {
        fVar425 = fVar373;
      }
    }
    if ((fVar355 != fVar423) || (NAN(fVar355) || NAN(fVar423))) {
      fVar434 = (float)(~-(uint)(fVar434 < 1.0) & 0x3f800000 |
                       (uint)fVar434 & -(uint)(fVar434 < 1.0));
      fVar425 = (float)(~-(uint)(fVar425 < 1.0) & (uint)fVar425 |
                       -(uint)(fVar425 < 1.0) & 0x3f800000);
    }
    fStack_520 = auVar120._8_4_;
    fStack_51c = auVar120._12_4_;
    auVar183._0_8_ =
         CONCAT44(~-(uint)(fVar425 < 1.0),~-(uint)(fVar434 < 0.0) & (uint)fVar434) &
         0x3f800000ffffffff;
    auVar183._8_8_ = 0;
    auVar184 = auVar183 | ZEXT416((uint)fVar425 & -(uint)(fVar425 < 1.0)) << 0x20;
    fVar423 = auVar184._4_4_;
    auVar156._4_4_ = fVar423;
    auVar156._0_4_ = fVar423;
    auVar156._8_4_ = fVar423;
    auVar156._12_4_ = fVar423;
    if (auVar184._0_4_ <= fVar423) {
      fVar425 = auVar184._0_4_ + -0.1;
      fVar430 = auVar184._8_4_ + 0.0;
      fVar434 = auVar184._12_4_ + 0.0;
      uVar113 = -(uint)(fVar423 + 0.1 < 1.0);
      fVar425 = (float)(~-(uint)(fVar425 < 0.0) & (uint)fVar425);
      fVar423 = (float)(~uVar113 & 0x3f800000 | (uint)(fVar423 + 0.1) & uVar113);
      fVar355 = 1.0 - fVar425;
      fVar373 = 1.0 - fVar425;
      fVar455 = 1.0 - fVar423;
      fVar431 = 1.0 - fVar423;
      fVar349 = fVar298 * fVar355 + fVar358 * fVar425;
      fVar294 = fVar299 * fVar373 + fVar367 * fVar425;
      fVar297 = fVar298 * fVar455 + fVar358 * fVar423;
      fVar298 = fVar299 * fVar431 + fVar367 * fVar423;
      fVar299 = fVar315 * fVar355 + fVar316 * fVar425;
      fVar358 = fVar416 * fVar373 + fVar426 * fVar425;
      fVar367 = fVar315 * fVar455 + fVar316 * fVar423;
      fVar315 = fVar416 * fVar431 + fVar426 * fVar423;
      fVar416 = fVar317 * fVar355 + fVar352 * fVar425;
      fVar316 = fVar448 * fVar373 + fVar370 * fVar425;
      fVar426 = fVar317 * fVar455 + fVar352 * fVar423;
      fVar317 = fVar448 * fVar431 + fVar370 * fVar423;
      fVar292 = fVar355 * fVar432 + fVar292 * fVar425;
      fVar293 = fVar373 * fVar290 + fVar293 * fVar425;
      fVar448 = fVar455 * fVar432 + fStack_520 * fVar423;
      fVar352 = fVar431 * fVar290 + fStack_51c * fVar423;
      fVar432 = (float)local_548._4_4_ * fVar430;
      fVar290 = (float)local_548._4_4_ * fVar434;
      fVar370 = (float)local_548._0_4_ * (1.0 - fVar423);
      fStack_540 = (float)local_548._0_4_ * (0.0 - fVar430);
      fStack_53c = (float)local_548._0_4_ * (0.0 - fVar434);
      local_548._0_4_ = (float)local_548._0_4_ * (1.0 - fVar425) + (float)local_548._4_4_ * fVar425;
      local_548._4_4_ = fVar370 + (float)local_548._4_4_ * fVar423;
      fStack_540 = fStack_540 + fVar432;
      fStack_53c = fStack_53c + fVar290;
      fVar248 = 1.0 / fVar248;
      auVar185._0_4_ = fVar448 - fVar292;
      auVar185._4_4_ = fVar352 - fVar293;
      auVar185._8_4_ = fVar448 - fVar448;
      auVar185._12_4_ = fVar352 - fVar352;
      auVar245._0_8_ = CONCAT44(fVar317 - fVar316,fVar426 - fVar416);
      auVar245._8_4_ = fVar426 - fVar426;
      auVar245._12_4_ = fVar317 - fVar317;
      auVar283._0_4_ = fVar367 - fVar299;
      auVar283._4_4_ = fVar315 - fVar358;
      auVar283._8_4_ = fVar367 - fVar367;
      auVar283._12_4_ = fVar315 - fVar315;
      auVar345._0_8_ = CONCAT44((fVar358 - fVar294) * 3.0,(fVar299 - fVar349) * 3.0);
      auVar345._8_4_ = (fVar367 - fVar297) * 3.0;
      auVar345._12_4_ = (fVar315 - fVar298) * 3.0;
      auVar266._0_8_ = CONCAT44((fVar316 - fVar358) * 3.0,(fVar416 - fVar299) * 3.0);
      auVar266._8_4_ = (fVar426 - fVar367) * 3.0;
      auVar266._12_4_ = (fVar317 - fVar315) * 3.0;
      auVar378._0_4_ = (fVar292 - fVar416) * 3.0;
      auVar378._4_4_ = (fVar293 - fVar316) * 3.0;
      auVar378._8_4_ = (fVar448 - fVar426) * 3.0;
      auVar378._12_4_ = (fVar352 - fVar317) * 3.0;
      auVar310._8_4_ = auVar266._8_4_;
      auVar310._0_8_ = auVar266._0_8_;
      auVar310._12_4_ = auVar266._12_4_;
      auVar254 = minps(auVar310,auVar378);
      auVar120 = maxps(auVar266,auVar378);
      auVar362._8_4_ = auVar345._8_4_;
      auVar362._0_8_ = auVar345._0_8_;
      auVar362._12_4_ = auVar345._12_4_;
      auVar119 = minps(auVar362,auVar254);
      auVar178 = maxps(auVar345,auVar120);
      auVar39._4_8_ = auVar120._8_8_;
      auVar39._0_4_ = auVar119._4_4_;
      auVar267._0_8_ = auVar39._0_8_ << 0x20;
      auVar267._8_4_ = auVar119._8_4_;
      auVar267._12_4_ = auVar119._12_4_;
      auVar268._8_8_ = auVar119._8_8_;
      auVar268._0_8_ = auVar267._8_8_;
      auVar40._4_8_ = auVar254._8_8_;
      auVar40._0_4_ = auVar178._4_4_;
      auVar311._0_8_ = auVar40._0_8_ << 0x20;
      auVar311._8_4_ = auVar178._8_4_;
      auVar311._12_4_ = auVar178._12_4_;
      auVar312._8_8_ = auVar178._8_8_;
      auVar312._0_8_ = auVar311._8_8_;
      auVar254 = minps(auVar119,auVar268);
      auVar120 = maxps(auVar178,auVar312);
      fVar355 = auVar254._0_4_ * fVar248;
      fVar373 = auVar254._4_4_ * fVar248;
      fVar455 = auVar254._8_4_ * fVar248;
      fVar431 = auVar254._12_4_ * fVar248;
      fVar299 = fVar248 * auVar120._0_4_;
      fVar367 = fVar248 * auVar120._4_4_;
      fVar416 = fVar248 * auVar120._8_4_;
      fVar248 = fVar248 * auVar120._12_4_;
      fVar352 = 1.0 / ((float)local_548._4_4_ - (float)local_548._0_4_);
      auVar150._0_8_ = CONCAT44(fVar298 - fVar294,fVar297 - fVar349);
      auVar150._8_4_ = fVar297 - fVar297;
      auVar150._12_4_ = fVar298 - fVar298;
      auVar323._8_4_ = auVar150._8_4_;
      auVar323._0_8_ = auVar150._0_8_;
      auVar323._12_4_ = auVar150._12_4_;
      auVar178 = minps(auVar323,auVar283);
      auVar120 = maxps(auVar150,auVar283);
      auVar230._8_4_ = auVar245._8_4_;
      auVar230._0_8_ = auVar245._0_8_;
      auVar230._12_4_ = auVar245._12_4_;
      auVar254 = minps(auVar230,auVar185);
      auVar178 = minps(auVar178,auVar254);
      auVar254 = maxps(auVar245,auVar185);
      auVar120 = maxps(auVar120,auVar254);
      fVar317 = auVar178._0_4_ * fVar352;
      fVar448 = auVar178._4_4_ * fVar352;
      fVar370 = fVar352 * auVar120._0_4_;
      fVar352 = fVar352 * auVar120._4_4_;
      local_528._4_4_ = local_548._0_4_;
      local_528._0_4_ = local_538.lower;
      fStack_520 = local_538.upper;
      fStack_51c = (float)local_548._4_4_;
      auVar313._4_4_ = local_548._4_4_;
      auVar313._0_4_ = local_538.upper;
      auVar313._8_4_ = fVar415;
      auVar313._12_4_ = fVar249;
      fVar293 = (local_538.lower + local_538.upper) * 0.5;
      fVar294 = ((float)local_548._0_4_ + (float)local_548._4_4_) * 0.5;
      fVar297 = (local_538.upper + fVar415) * 0.0;
      fVar298 = ((float)local_548._4_4_ + fVar249) * 0.0;
      fVar423 = (fVar447 - fVar436) * fVar293 + fVar436;
      fVar425 = (fVar454 - fVar271) * fVar293 + fVar271;
      fVar430 = (fVar273 - fVar458) * fVar293 + fVar204;
      fVar432 = (fVar276 - fVar199) * fVar293 + fVar235;
      fVar434 = (fVar402 - fVar447) * fVar293 + fVar399;
      fVar290 = (fVar422 - fVar454) * fVar293 + fVar409;
      fVar349 = (fVar399 - fVar273) * fVar293 + fVar273;
      fVar292 = (fVar409 - fVar276) * fVar293 + fVar276;
      fVar423 = (fVar434 - fVar423) * fVar293 + fVar423;
      fVar425 = (fVar290 - fVar425) * fVar293 + fVar425;
      fVar430 = (fVar349 - fVar430) * fVar293 + fVar430;
      fVar432 = (fVar292 - fVar432) * fVar293 + fVar432;
      fVar434 = ((((fVar424 - fVar402) * fVar293 + fVar402) - fVar434) * fVar293 + fVar434) -
                fVar423;
      fVar290 = ((((fVar433 - fVar422) * fVar293 + fVar422) - fVar290) * fVar293 + fVar290) -
                fVar425;
      fVar349 = ((((fVar239 - fVar399) * fVar293 + p02.field_0.v[2]) - fVar349) * fVar293 + fVar349)
                - fVar430;
      fVar292 = ((((fVar238 - fVar409) * fVar293 + p02.field_0.v[3]) - fVar292) * fVar293 + fVar292)
                - fVar432;
      fVar423 = fVar293 * fVar434 + fVar423;
      fVar425 = fVar293 * fVar290 + fVar425;
      fVar434 = fVar434 * 3.0;
      fVar290 = fVar290 * 3.0;
      fVar430 = (fVar293 * fVar349 + fVar430) - fVar423;
      fVar432 = (fVar293 * fVar292 + fVar432) - fVar425;
      fVar434 = (fVar349 * 3.0 - fVar434) * fVar294 + fVar434;
      fVar290 = (fVar292 * 3.0 - fVar290) * fVar294 + fVar290;
      auVar246._0_8_ = CONCAT44(fVar434,fVar430) ^ 0x80000000;
      auVar246._8_4_ = fVar434;
      auVar246._12_4_ = fVar434;
      fVar319 = local_538.lower - fVar293;
      fVar329 = (float)local_548._0_4_ - fVar294;
      fVar457 = local_538.upper - fVar297;
      fVar331 = (float)local_548._4_4_ - fVar298;
      fVar353 = local_538.upper - fVar293;
      fVar332 = (float)local_548._4_4_ - fVar294;
      fVar415 = fVar415 - fVar297;
      fVar249 = fVar249 - fVar298;
      fVar423 = fVar430 * fVar294 + fVar423;
      fVar425 = fVar432 * fVar294 + fVar425;
      auVar269._0_8_ = CONCAT44(fVar290,fVar432) ^ 0x8000000000000000;
      auVar269._8_4_ = -fVar290;
      auVar269._12_4_ = -fVar290;
      auVar151._0_4_ = fVar432 * fVar434 - fVar290 * fVar430;
      auVar151._4_4_ = auVar151._0_4_;
      auVar151._8_4_ = auVar151._0_4_;
      auVar151._12_4_ = auVar151._0_4_;
      auVar254 = divps(auVar269,auVar151);
      auVar120 = divps(auVar246,auVar151);
      fVar297 = auVar254._0_4_;
      fVar298 = auVar254._4_4_;
      fVar349 = auVar120._0_4_;
      fVar292 = auVar120._4_4_;
      fVar293 = fVar293 - (fVar425 * fVar349 + fVar423 * fVar297);
      fVar434 = fVar294 - (fVar425 * fVar292 + fVar423 * fVar298);
      fVar290 = fVar294 - (fVar425 * auVar120._8_4_ + fVar423 * auVar254._8_4_);
      fVar294 = fVar294 - (fVar425 * auVar120._12_4_ + fVar423 * auVar254._12_4_);
      auVar186._0_8_ = CONCAT44(fVar298 * fVar317,fVar298 * fVar355);
      auVar186._8_4_ = fVar298 * fVar373;
      auVar186._12_4_ = fVar298 * fVar448;
      auVar152._0_4_ = fVar298 * fVar299;
      auVar152._4_4_ = fVar298 * fVar370;
      auVar152._8_4_ = fVar298 * fVar367;
      auVar152._12_4_ = fVar298 * fVar352;
      auVar453._8_4_ = auVar186._8_4_;
      auVar453._0_8_ = auVar186._0_8_;
      auVar453._12_4_ = auVar186._12_4_;
      auVar119 = minps(auVar453,auVar152);
      auVar120 = maxps(auVar152,auVar186);
      auVar284._0_8_ = CONCAT44(fVar292 * fVar448,fVar292 * fVar373);
      auVar284._8_4_ = fVar292 * fVar455;
      auVar284._12_4_ = fVar292 * fVar431;
      auVar187._0_4_ = fVar292 * fVar367;
      auVar187._4_4_ = fVar292 * fVar352;
      auVar187._8_4_ = fVar292 * fVar416;
      auVar187._12_4_ = fVar292 * fVar248;
      auVar363._8_4_ = auVar284._8_4_;
      auVar363._0_8_ = auVar284._0_8_;
      auVar363._12_4_ = auVar284._12_4_;
      auVar178 = minps(auVar363,auVar187);
      auVar254 = maxps(auVar187,auVar284);
      fVar423 = 0.0 - (auVar254._0_4_ + auVar120._0_4_);
      fVar425 = 1.0 - (auVar254._4_4_ + auVar120._4_4_);
      fVar430 = 0.0 - (auVar254._8_4_ + auVar120._8_4_);
      fVar432 = 0.0 - (auVar254._12_4_ + auVar120._12_4_);
      fVar358 = 0.0 - (auVar178._0_4_ + auVar119._0_4_);
      fVar315 = 1.0 - (auVar178._4_4_ + auVar119._4_4_);
      fVar316 = 0.0 - (auVar178._8_4_ + auVar119._8_4_);
      fVar426 = 0.0 - (auVar178._12_4_ + auVar119._12_4_);
      auVar188._0_8_ = CONCAT44(fVar329 * fVar425,fVar319 * fVar423);
      auVar188._8_4_ = fVar457 * fVar430;
      auVar188._12_4_ = fVar331 * fVar432;
      auVar379._0_8_ = CONCAT44(fVar317 * fVar297,fVar355 * fVar297);
      auVar379._8_4_ = fVar373 * fVar297;
      auVar379._12_4_ = fVar448 * fVar297;
      auVar285._0_4_ = fVar297 * fVar299;
      auVar285._4_4_ = fVar297 * fVar370;
      auVar285._8_4_ = fVar297 * fVar367;
      auVar285._12_4_ = fVar297 * fVar352;
      auVar364._8_4_ = auVar379._8_4_;
      auVar364._0_8_ = auVar379._0_8_;
      auVar364._12_4_ = auVar379._12_4_;
      auVar254 = minps(auVar364,auVar285);
      auVar120 = maxps(auVar285,auVar379);
      auVar324._0_8_ = CONCAT44(fVar448 * fVar349,fVar373 * fVar349);
      auVar324._8_4_ = fVar455 * fVar349;
      auVar324._12_4_ = fVar431 * fVar349;
      auVar380._0_4_ = fVar349 * fVar367;
      auVar380._4_4_ = fVar349 * fVar352;
      auVar380._8_4_ = fVar349 * fVar416;
      auVar380._12_4_ = fVar349 * fVar248;
      auVar442._8_4_ = auVar324._8_4_;
      auVar442._0_8_ = auVar324._0_8_;
      auVar442._12_4_ = auVar324._12_4_;
      auVar119 = minps(auVar442,auVar380);
      auVar365._0_4_ = fVar319 * fVar358;
      auVar365._4_4_ = fVar329 * fVar315;
      auVar365._8_4_ = fVar457 * fVar316;
      auVar365._12_4_ = fVar331 * fVar426;
      auVar153._0_8_ = CONCAT44(fVar425 * fVar332,fVar423 * fVar353);
      auVar153._8_4_ = fVar430 * fVar415;
      auVar153._12_4_ = fVar432 * fVar249;
      auVar295._0_4_ = fVar358 * fVar353;
      auVar295._4_4_ = fVar315 * fVar332;
      auVar295._8_4_ = fVar316 * fVar415;
      auVar295._12_4_ = fVar426 * fVar249;
      auVar178 = maxps(auVar380,auVar324);
      fVar248 = 1.0 - (auVar178._0_4_ + auVar120._0_4_);
      fVar423 = 0.0 - (auVar178._4_4_ + auVar120._4_4_);
      fVar425 = 0.0 - (auVar178._8_4_ + auVar120._8_4_);
      fVar430 = 0.0 - (auVar178._12_4_ + auVar120._12_4_);
      fVar432 = 1.0 - (auVar119._0_4_ + auVar254._0_4_);
      fVar299 = 0.0 - (auVar119._4_4_ + auVar254._4_4_);
      fVar358 = 0.0 - (auVar119._8_4_ + auVar254._8_4_);
      fVar367 = 0.0 - (auVar119._12_4_ + auVar254._12_4_);
      auVar325._0_8_ = CONCAT44(fVar329 * fVar423,fVar319 * fVar248);
      auVar325._8_4_ = fVar457 * fVar425;
      auVar325._12_4_ = fVar331 * fVar430;
      auVar395._0_4_ = fVar319 * fVar432;
      auVar395._4_4_ = fVar329 * fVar299;
      auVar395._8_4_ = fVar457 * fVar358;
      auVar395._12_4_ = fVar331 * fVar367;
      auVar286._0_8_ = CONCAT44(fVar423 * fVar332,fVar248 * fVar353);
      auVar286._8_4_ = fVar425 * fVar415;
      auVar286._12_4_ = fVar430 * fVar249;
      auVar346._0_4_ = fVar432 * fVar353;
      auVar346._4_4_ = fVar299 * fVar332;
      auVar346._8_4_ = fVar358 * fVar415;
      auVar346._12_4_ = fVar367 * fVar249;
      auVar381._8_4_ = auVar325._8_4_;
      auVar381._0_8_ = auVar325._0_8_;
      auVar381._12_4_ = auVar325._12_4_;
      auVar120 = minps(auVar381,auVar395);
      auVar421._8_4_ = auVar286._8_4_;
      auVar421._0_8_ = auVar286._0_8_;
      auVar421._12_4_ = auVar286._12_4_;
      auVar254 = minps(auVar421,auVar346);
      auVar341 = minps(auVar120,auVar254);
      auVar254 = maxps(auVar395,auVar325);
      auVar120 = maxps(auVar346,auVar286);
      auVar178 = maxps(auVar120,auVar254);
      auVar326._8_4_ = auVar188._8_4_;
      auVar326._0_8_ = auVar188._0_8_;
      auVar326._12_4_ = auVar188._12_4_;
      auVar254 = minps(auVar326,auVar365);
      auVar287._8_4_ = auVar153._8_4_;
      auVar287._0_8_ = auVar153._0_8_;
      auVar287._12_4_ = auVar153._12_4_;
      auVar120 = minps(auVar287,auVar295);
      auVar254 = minps(auVar254,auVar120);
      auVar119 = maxps(auVar365,auVar188);
      auVar120 = maxps(auVar295,auVar153);
      auVar120 = maxps(auVar120,auVar119);
      auVar327._0_4_ = auVar341._4_4_ + auVar341._0_4_ + fVar293;
      auVar327._4_4_ = auVar254._4_4_ + auVar254._0_4_ + fVar434;
      auVar327._8_4_ = auVar341._8_4_ + auVar341._4_4_ + fVar290;
      auVar327._12_4_ = auVar341._12_4_ + auVar254._4_4_ + fVar294;
      fVar248 = auVar178._4_4_ + auVar178._0_4_ + fVar293;
      fVar249 = auVar120._4_4_ + auVar120._0_4_ + fVar434;
      auVar154._4_4_ = fVar249;
      auVar154._0_4_ = fVar248;
      auVar184 = maxps(_local_528,auVar327);
      auVar154._8_4_ = auVar178._8_4_ + auVar178._4_4_ + fVar290;
      auVar154._12_4_ = auVar178._12_4_ + auVar120._4_4_ + fVar294;
      auVar120 = minps(auVar154,auVar313);
      iVar202 = -(uint)(auVar120._0_4_ < auVar184._0_4_);
      iVar232 = -(uint)(auVar120._4_4_ < auVar184._4_4_);
      auVar155._4_4_ = iVar232;
      auVar155._0_4_ = iVar202;
      auVar155._8_4_ = iVar232;
      auVar155._12_4_ = iVar232;
      auVar156._8_8_ = auVar155._8_8_;
      auVar156._4_4_ = (float)iVar202;
      auVar156._0_4_ = (float)iVar202;
      iVar202 = movmskpd((uint)(fVar428 < 0.0),auVar156);
      auVar147 = _local_528;
      if (iVar202 == 0) {
        bVar101 = 0;
        if ((local_538.lower < auVar327._0_4_) && (fVar248 < local_538.upper)) {
          bVar101 = -(fVar249 < (float)local_548._4_4_) & (float)local_548._0_4_ < auVar327._4_4_;
        }
        bVar101 = bVar110 | bVar101;
        uVar103 = (ulong)CONCAT31(uVar38,bVar101);
        if (bVar101 != 1) goto LAB_003d3041;
        uVar103 = 0xc9;
        do {
          uVar103 = uVar103 - 1;
          if (uVar103 == 0) goto LAB_003d36c5;
          fVar249 = 1.0 - fVar293;
          fVar428 = fVar293 * fVar293 * fVar293;
          fVar425 = fVar293 * fVar293 * 3.0 * fVar249;
          fVar248 = fVar249 * fVar249 * fVar249;
          fVar430 = fVar293 * 3.0 * fVar249 * fVar249;
          fVar249 = fVar248 * fVar436 + fVar430 * fVar399 + fVar425 * fVar402 + fVar428 * fVar424;
          fVar415 = fVar248 * fVar271 + fVar430 * fVar409 + fVar425 * fVar422 + fVar428 * fVar433;
          fVar423 = fVar248 * fVar204 +
                    fVar430 * fVar273 + fVar425 * p02.field_0.v[2] + fVar428 * fVar239;
          fVar425 = fVar248 * fVar235 +
                    fVar430 * fVar276 + fVar425 * p02.field_0.v[3] + fVar428 * fVar238;
          fVar428 = (fVar423 - fVar249) * fVar434;
          fVar430 = (fVar425 - fVar415) * fVar434;
          fVar248 = (fVar423 - fVar249) * fVar434 + fVar249;
          fVar423 = (fVar425 - fVar415) * fVar434 + fVar415;
          fVar293 = fVar293 - (fVar423 * fVar349 + fVar248 * fVar297);
          fVar434 = fVar434 - (fVar423 * fVar292 + fVar248 * fVar298);
          fVar425 = ABS(fVar423);
          auVar156._0_8_ = CONCAT44(fVar423,fVar248) & 0x7fffffff7fffffff;
          auVar156._8_4_ = ABS(fVar428 + fVar249);
          auVar156._12_4_ = ABS(fVar430 + fVar415);
          auVar184._0_8_ = CONCAT44(fVar423,fVar423) & 0x7fffffff7fffffff;
          auVar184._8_4_ = (int)fVar425;
          auVar184._12_4_ = (int)fVar425;
          if (fVar425 <= ABS(fVar248)) {
            auVar184._0_4_ = ABS(fVar248);
          }
        } while (fVar237 <= auVar184._0_4_);
        if ((((0.0 <= fVar293) && (fVar293 <= 1.0)) &&
            (auVar156._4_4_ = fVar434, auVar156._0_4_ = fVar434, auVar156._8_4_ = fVar434,
            auVar156._12_4_ = fVar434, 0.0 <= fVar434)) && (fVar434 <= 1.0)) {
          fVar248 = pre->ray_space[k].vx.field_0.m128[2];
          fVar249 = pre->ray_space[k].vy.field_0.m128[2];
          fVar415 = pre->ray_space[k].vz.field_0.m128[2];
          auVar189._0_4_ = fVar333 * fVar248;
          auVar189._4_4_ = fVar347 * fVar249;
          auVar189._8_4_ = fVar350 * fVar415;
          auVar189._12_4_ = (fVar372 - 0.0) * 0.0;
          auVar190._8_8_ = auVar189._8_8_;
          auVar190._0_8_ = auVar190._8_8_;
          auVar184._4_12_ = auVar190._4_12_;
          fVar290 = 1.0 - fVar434;
          fVar432 = 1.0 - fVar293;
          fVar423 = fVar432 * fVar432 * fVar432;
          fVar425 = fVar293 * 3.0 * fVar432 * fVar432;
          fVar430 = fVar293 * fVar293 * fVar293;
          fVar428 = fVar293 * fVar293 * 3.0 * fVar432;
          auVar184._0_4_ =
               ((auVar189._8_4_ + auVar189._4_4_ + auVar189._0_4_) * fVar290 +
               (fVar200 * fVar415 + fVar196 * fVar249 + fVar456 * fVar248) * fVar434) * fVar423 +
               ((fVar427 * fVar415 + fVar407 * fVar249 + fVar384 * fVar248) * fVar290 +
               (fVar277 * fVar415 + fVar274 * fVar249 + fVar437 * fVar248) * fVar434) * fVar425 +
               ((fVar445 * fVar415 + fVar412 * fVar249 + fVar397 * fVar248) * fVar290 +
               (fVar413 * fVar415 + fVar404 * fVar249 + fVar386 * fVar248) * fVar434) * fVar428 +
               (fVar290 * (fVar408 * fVar415 + fVar429 * fVar249 + fVar385 * fVar248) +
               (fVar415 * fVar198 + fVar249 * fVar195 + fVar248 * fVar161) * fVar434) * fVar430;
          if ((fVar247 <= auVar184._0_4_) &&
             (fVar248 = *(float *)(ray + k * 4 + 0x80), auVar184._0_4_ <= fVar248)) {
            fVar292 = 1.0 - fVar434;
            fVar294 = 1.0 - fVar434;
            fVar297 = 1.0 - fVar434;
            fVar298 = 1.0 - fVar434;
            fVar249 = fVar387 * fVar292 + fVar334 * fVar434;
            fVar415 = fVar388 * fVar294 + fVar348 * fVar434;
            fVar290 = fVar405 * fVar297 + fVar351 * fVar434;
            fVar349 = fVar410 * fVar298 + fVar354 * fVar434;
            fVar299 = fVar252 * fVar292 + fVar383 * fVar434;
            fVar367 = fVar270 * fVar294 + fVar296 * fVar434;
            fVar416 = fVar272 * fVar297 + fVar318 * fVar434;
            fVar426 = fVar275 * fVar298 + fVar396 * fVar434;
            fVar358 = fVar299 - fVar249;
            fVar315 = fVar367 - fVar415;
            fVar316 = fVar416 - fVar290;
            fVar317 = fVar426 - fVar349;
            fVar249 = (((fVar249 - (fVar357 * fVar292 + fVar291 * fVar434)) * fVar432 +
                       fVar293 * fVar358) * fVar432 +
                      (fVar358 * fVar432 +
                      ((fVar292 * fVar382 + fVar414 * fVar434) - fVar299) * fVar293) * fVar293) *
                      3.0;
            fVar415 = (((fVar415 - (fVar366 * fVar294 + fVar203 * fVar434)) * fVar432 +
                       fVar293 * fVar315) * fVar432 +
                      (fVar315 * fVar432 +
                      ((fVar294 * fVar250 + fVar398 * fVar434) - fVar367) * fVar293) * fVar293) *
                      3.0;
            fVar290 = (((fVar290 - (fVar369 * fVar297 + fVar314 * fVar434)) * fVar432 +
                       fVar293 * fVar316) * fVar432 +
                      (fVar316 * fVar432 +
                      ((fVar297 * fVar251 + fVar403 * fVar434) - fVar416) * fVar293) * fVar293) *
                      3.0;
            fVar432 = (((fVar349 - (fVar372 * fVar298 + fVar328 * fVar434)) * fVar432 +
                       fVar293 * fVar317) * fVar432 +
                      (fVar317 * fVar432 +
                      ((fVar298 * fVar330 + fVar253 * fVar434) - fVar426) * fVar293) * fVar293) *
                      3.0;
            pGVar23 = (context->scene->geometries).items[uVar111].ptr;
            uVar103 = (ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar349 = fVar423 * (fVar291 - fVar357) +
                        fVar425 * (fVar334 - fVar387) +
                        fVar428 * (fVar383 - fVar252) + fVar430 * (fVar414 - fVar382);
              fVar292 = fVar423 * (fVar203 - fVar366) +
                        fVar425 * (fVar348 - fVar388) +
                        fVar428 * (fVar296 - fVar270) + fVar430 * (fVar398 - fVar250);
              fVar294 = fVar423 * (fVar314 - fVar369) +
                        fVar425 * (fVar351 - fVar405) +
                        fVar428 * (fVar318 - fVar272) + fVar430 * (fVar403 - fVar251);
              fVar423 = fVar423 * (fVar328 - fVar372) +
                        fVar425 * (fVar354 - fVar410) +
                        fVar428 * (fVar396 - fVar275) + fVar430 * (fVar253 - fVar330);
              auVar288._0_4_ = fVar292 * fVar249 - fVar415 * fVar349;
              auVar288._4_4_ = fVar294 * fVar415 - fVar290 * fVar292;
              auVar288._8_4_ = fVar349 * fVar290 - fVar249 * fVar294;
              auVar288._12_4_ = fVar423 * fVar432 - fVar432 * fVar423;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = auVar184._0_4_;
                *(float *)(ray + k * 4 + 0xc0) = auVar288._4_4_;
                auVar41._4_8_ = auVar190._8_8_;
                auVar41._0_4_ = auVar288._4_4_;
                auVar191._0_8_ = auVar41._0_8_ << 0x20;
                auVar191._8_4_ = auVar288._8_4_;
                auVar191._12_4_ = auVar288._12_4_;
                auVar184._8_8_ = auVar288._8_8_;
                auVar184._0_8_ = auVar191._8_8_;
                *(float *)(ray + k * 4 + 0xd0) = auVar288._8_4_;
                *(float *)(ray + k * 4 + 0xe0) = auVar288._0_4_;
                *(float *)(ray + k * 4 + 0xf0) = fVar293;
                *(float *)(ray + k * 4 + 0x100) = fVar434;
                *(uint *)(ray + k * 4 + 0x110) = uVar112;
                *(uint *)(ray + k * 4 + 0x120) = uVar111;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar113 = context->user->instPrimID[0];
                uVar103 = (ulong)uVar113;
                *(uint *)(ray + k * 4 + 0x140) = uVar113;
              }
              else {
                local_e8 = auVar288._4_4_;
                fStack_e4 = auVar288._4_4_;
                fStack_e0 = auVar288._4_4_;
                fStack_dc = auVar288._4_4_;
                local_d8 = auVar288._8_4_;
                fStack_d4 = auVar288._8_4_;
                fStack_d0 = auVar288._8_4_;
                fStack_cc = auVar288._8_4_;
                local_c8 = auVar288._0_4_;
                fStack_c4 = auVar288._0_4_;
                fStack_c0 = auVar288._0_4_;
                fStack_bc = auVar288._0_4_;
                local_b8 = fVar293;
                fStack_b4 = fVar293;
                fStack_b0 = fVar293;
                fStack_ac = fVar293;
                local_a8 = auVar156;
                local_98 = CONCAT44(uVar112,uVar112);
                uStack_90 = CONCAT44(uVar112,uVar112);
                local_88 = CONCAT44(uVar111,uVar111);
                uStack_80 = CONCAT44(uVar111,uVar111);
                local_78 = context->user->instID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                local_68 = context->user->instPrimID[0];
                uStack_64 = local_68;
                uStack_60 = local_68;
                uStack_5c = local_68;
                *(float *)(ray + k * 4 + 0x80) = auVar184._0_4_;
                local_3a8 = *local_390;
                args.valid = (int *)local_3a8;
                args.geometryUserPtr = pGVar23->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&local_e8;
                args.N = 4;
                p_Var104 = pGVar23->intersectionFilterN;
                args.ray = (RTCRayN *)ray;
                if (p_Var104 != (RTCFilterFunctionN)0x0) {
                  p_Var104 = (RTCFilterFunctionN)(*p_Var104)(&args);
                  uVar108 = local_4f8;
                }
                auVar192._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                auVar192._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar192._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                auVar192._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                uVar113 = movmskps((int)p_Var104,auVar192);
                pRVar105 = (RTCRayN *)(ulong)(uVar113 ^ 0xf);
                if ((uVar113 ^ 0xf) == 0) {
                  auVar192 = auVar192 ^ _DAT_01f46b70;
                  auVar156 = local_3a8;
                }
                else {
                  p_Var104 = context->args->filter;
                  if ((p_Var104 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar23->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    p_Var104 = (RTCFilterFunctionN)(*p_Var104)(&args);
                    uVar108 = local_4f8;
                  }
                  auVar156._0_4_ = (float)-(uint)(local_3a8._0_4_ == 0);
                  auVar156._4_4_ = (float)-(uint)(local_3a8._4_4_ == 0);
                  auVar156._8_4_ = (float)-(uint)(local_3a8._8_4_ == 0);
                  auVar156._12_4_ = (float)-(uint)(local_3a8._12_4_ == 0);
                  auVar192 = auVar156 ^ _DAT_01f46b70;
                  uVar113 = movmskps((int)p_Var104,auVar156);
                  pRVar105 = (RTCRayN *)(ulong)(uVar113 ^ 0xf);
                  if ((uVar113 ^ 0xf) != 0) {
                    uVar113 = *(uint *)(args.hit + 4);
                    uVar114 = *(uint *)(args.hit + 8);
                    uVar66 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~(uint)auVar156._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0xc4) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 200) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0xcc) & (uint)auVar156._12_4_;
                    uVar113 = *(uint *)(args.hit + 0x14);
                    uVar114 = *(uint *)(args.hit + 0x18);
                    uVar66 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0xd4) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 0xd8) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0xdc) & (uint)auVar156._12_4_;
                    uVar113 = *(uint *)(args.hit + 0x24);
                    uVar114 = *(uint *)(args.hit + 0x28);
                    uVar66 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0xe4) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 0xe8) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0xec) & (uint)auVar156._12_4_;
                    uVar113 = *(uint *)(args.hit + 0x34);
                    uVar114 = *(uint *)(args.hit + 0x38);
                    uVar66 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0xf4) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 0xf8) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0xfc) & (uint)auVar156._12_4_;
                    uVar113 = *(uint *)(args.hit + 0x44);
                    uVar114 = *(uint *)(args.hit + 0x48);
                    uVar66 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0x104) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 0x108) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0x10c) & (uint)auVar156._12_4_;
                    uVar113 = *(uint *)(args.hit + 0x54);
                    uVar114 = *(uint *)(args.hit + 0x58);
                    uVar66 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & (uint)auVar156._0_4_ |
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & (uint)auVar156._4_4_ |
                         ~(uint)auVar156._4_4_ & uVar113;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & (uint)auVar156._8_4_ |
                         ~(uint)auVar156._8_4_ & uVar114;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & (uint)auVar156._12_4_ |
                         ~(uint)auVar156._12_4_ & uVar66;
                    uVar113 = *(uint *)(args.hit + 100);
                    uVar114 = *(uint *)(args.hit + 0x68);
                    uVar66 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & (uint)auVar156._0_4_ |
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & (uint)auVar156._4_4_ |
                         ~(uint)auVar156._4_4_ & uVar113;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & (uint)auVar156._8_4_ |
                         ~(uint)auVar156._8_4_ & uVar114;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & (uint)auVar156._12_4_ |
                         ~(uint)auVar156._12_4_ & uVar66;
                    uVar113 = *(uint *)(args.hit + 0x74);
                    uVar114 = *(uint *)(args.hit + 0x78);
                    uVar66 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~(uint)auVar156._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & (uint)auVar156._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~(uint)auVar156._4_4_ & uVar113 |
                         *(uint *)(args.ray + 0x134) & (uint)auVar156._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~(uint)auVar156._8_4_ & uVar114 |
                         *(uint *)(args.ray + 0x138) & (uint)auVar156._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~(uint)auVar156._12_4_ & uVar66 |
                         *(uint *)(args.ray + 0x13c) & (uint)auVar156._12_4_;
                    auVar156 = ~auVar156 & *(undefined1 (*) [16])(args.hit + 0x80) |
                               *(undefined1 (*) [16])(args.ray + 0x140) & auVar156;
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar156;
                    pRVar105 = args.ray;
                  }
                }
                auVar184._0_4_ = (float)(auVar192._0_4_ << 0x1f);
                auVar184._4_4_ = auVar192._4_4_ << 0x1f;
                auVar184._8_4_ = auVar192._8_4_ << 0x1f;
                auVar184._12_4_ = auVar192._12_4_ << 0x1f;
                uVar113 = movmskps((int)pRVar105,auVar184);
                uVar103 = (ulong)uVar113;
                if (uVar113 == 0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar248;
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_003d36c5;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }